

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstm.cpp
# Opt level: O2

int ncnn::lstm(Mat *bottom_blob,Mat *top_blob,int reverse,Mat *weight_xc,Mat *bias_c,Mat *weight_hc,
              Mat *hidden_state,Mat *cell_state,Option *opt)

{
  float *pfVar1;
  float *pfVar2;
  uint uVar3;
  undefined4 uVar4;
  void *pvVar5;
  void *pvVar6;
  void *pvVar7;
  float fVar8;
  float fVar9;
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  uint uVar12;
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  int *piVar23;
  void *pvVar24;
  uint uVar25;
  uint uVar26;
  long lVar27;
  long lVar28;
  long lVar29;
  long lVar30;
  long lVar31;
  uint uVar32;
  uint uVar33;
  void *pvVar34;
  void *pvVar35;
  void *pvVar36;
  ulong uVar37;
  ulong uVar38;
  long lVar39;
  void *pvVar40;
  void *pvVar41;
  uint uVar42;
  void *pvVar43;
  void *pvVar44;
  void *pvVar45;
  void *pvVar46;
  long lVar47;
  void *pvVar48;
  int iVar49;
  ulong uVar50;
  long lVar51;
  float *pfVar52;
  long lVar53;
  int iVar54;
  uint uVar55;
  long lVar56;
  void *pvVar57;
  long lVar58;
  void *pvVar59;
  long lVar60;
  long lVar61;
  void *pvVar62;
  long lVar63;
  float *pfVar64;
  void *pvVar65;
  void *pvVar66;
  void *pvVar67;
  void *pvVar68;
  int iVar69;
  void *pvVar70;
  void *pvVar71;
  long lVar72;
  void *pvVar73;
  long lVar74;
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [64];
  float fVar83;
  undefined1 auVar86 [32];
  float fVar97;
  undefined1 auVar87 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  float fVar95;
  float fVar96;
  float fVar98;
  float fVar99;
  float fVar100;
  undefined1 in_ZMM1 [64];
  undefined1 auVar94 [64];
  undefined1 auVar101 [16];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [64];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 in_ZMM3 [64];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  float fVar126;
  undefined1 auVar120 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar125 [64];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  float fVar129;
  float fVar130;
  float fVar131;
  undefined1 in_ZMM5 [64];
  float fVar132;
  float fVar133;
  float fVar134;
  float fVar135;
  float fVar136;
  float fVar137;
  float fVar138;
  undefined1 in_ZMM6 [64];
  undefined1 auVar139 [16];
  undefined1 auVar140 [64];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 in_ZMM9 [64];
  float fVar143;
  float fVar144;
  float fVar145;
  float fVar146;
  float fVar147;
  float fVar148;
  float fVar149;
  float fVar150;
  undefined1 in_ZMM10 [64];
  float fVar151;
  float fVar152;
  float fVar153;
  float fVar154;
  float fVar155;
  float fVar156;
  float fVar157;
  undefined1 auVar158 [32];
  void *local_2a8;
  void *local_2a0;
  void *local_298;
  void *local_290;
  void *local_288;
  void *local_278;
  void *local_270;
  float *gates_data_F;
  float *gates_data_I;
  float *bias_c_F;
  float *bias_c_I;
  void *local_230;
  void *local_228;
  void *local_220;
  float *gates_data_G;
  float *gates_data_O;
  float *bias_c_G;
  float *bias_c_O;
  int local_1c0;
  Mat local_78;
  undefined1 auVar88 [32];
  undefined1 auVar109 [32];
  undefined1 auVar116 [32];
  undefined1 auVar121 [32];
  undefined1 auVar124 [32];
  
  uVar42 = bottom_blob->w;
  uVar3 = bottom_blob->h;
  uVar32 = top_blob->w;
  local_78.cstep = 0;
  local_78.data = (Allocator *)0x0;
  local_78.refcount._0_4_ = 0;
  local_78.refcount._4_4_ = 0;
  local_78.elemsize = SUB168(ZEXT816(0) << 0x40,4);
  local_78.elempack = 0;
  local_78.allocator = (Allocator *)local_78.data;
  local_78.dims = (int)local_78.refcount;
  local_78.w = local_78.refcount._4_4_;
  local_78._48_8_ = local_78.elemsize;
  local_78.c = local_78.elempack;
  Mat::create(&local_78,uVar32,4,4,opt->workspace_allocator);
  local_1c0 = -100;
  if (((Allocator *)local_78.data != (Allocator *)0x0) && ((long)local_78.c * local_78.cstep != 0))
  {
    uVar38 = (ulong)(int)uVar32;
    uVar50 = uVar38 & 0xfffffffffffffffe;
    iVar54 = (int)uVar42 >> 3;
    uVar42 = uVar42 & 7;
    iVar69 = (int)uVar32 >> 3;
    uVar55 = uVar32 & 7;
    lVar56 = (long)(int)(uVar32 * 2);
    lVar58 = (long)(int)(uVar32 * 3);
    local_1c0 = 0;
    uVar12 = (int)uVar32 >> 1;
    if ((int)uVar32 >> 1 < 1) {
      uVar12 = 0;
    }
    uVar32 = 0;
    if (0 < (int)uVar3) {
      uVar32 = uVar3;
    }
    for (uVar33 = 0; pvVar24 = local_78.data, uVar33 != uVar32; uVar33 = uVar33 + 1) {
      uVar25 = ~uVar33 + uVar3;
      if (reverse == 0) {
        uVar25 = uVar33;
      }
      lVar27 = (long)(int)uVar25;
      lVar39 = bottom_blob->w * lVar27 * bottom_blob->elemsize;
      pvVar5 = bottom_blob->data;
      pvVar6 = bias_c->data;
      lVar28 = (long)bias_c->w * bias_c->elemsize;
      lVar29 = (long)local_78.w * local_78.elemsize;
      lVar72 = (long)weight_xc->w * weight_xc->elemsize;
      lVar61 = (long)weight_hc->w * weight_hc->elemsize;
      pvVar65 = weight_xc->data;
      pvVar34 = (void *)(lVar72 * (lVar58 + 1) + (long)pvVar65);
      pvVar35 = (void *)(lVar72 * (lVar56 + 1) + (long)pvVar65);
      pvVar36 = (void *)(lVar72 * (uVar38 + 1) + (long)pvVar65);
      pvVar70 = (void *)(lVar72 * lVar58 + (long)pvVar65);
      pvVar45 = (void *)(lVar72 * lVar56 + (long)pvVar65);
      lVar30 = lVar72 * 2;
      pvVar73 = (void *)(lVar72 * uVar38 + (long)pvVar65);
      pvVar67 = weight_hc->data;
      pvVar59 = (void *)(lVar61 * (lVar58 + 1) + (long)pvVar67);
      pvVar48 = (void *)(lVar61 * (lVar56 + 1) + (long)pvVar67);
      pvVar66 = (void *)(lVar61 * (uVar38 + 1) + (long)pvVar67);
      pvVar43 = (void *)(lVar61 * lVar58 + (long)pvVar67);
      pvVar40 = (void *)(lVar61 * lVar56 + (long)pvVar67);
      lVar31 = lVar61 * 2;
      pvVar62 = (void *)(lVar61 * uVar38 + (long)pvVar67);
      pvVar7 = hidden_state->data;
      lVar53 = 0;
      lVar60 = 0;
      pvVar41 = pvVar34;
      pvVar44 = pvVar70;
      pvVar46 = (void *)((long)pvVar65 + lVar72);
      pvVar57 = pvVar65;
      pvVar68 = pvVar36;
      pvVar71 = pvVar35;
      local_2a8 = pvVar43;
      local_2a0 = pvVar48;
      local_298 = pvVar40;
      local_290 = pvVar62;
      local_288 = pvVar67;
      local_278 = pvVar66;
      local_270 = (void *)((long)pvVar67 + lVar61);
      local_230 = pvVar45;
      local_228 = pvVar73;
      local_220 = pvVar59;
      for (uVar37 = 0; uVar37 != uVar12; uVar37 = uVar37 + 1) {
        lVar47 = uVar37 * 2 + 1;
        auVar82 = ZEXT1664(ZEXT816(0) << 0x40);
        lVar63 = 0;
        auVar94 = ZEXT1664(ZEXT816(0) << 0x40);
        auVar104 = ZEXT1664(ZEXT816(0) << 0x40);
        auVar125 = ZEXT1664(ZEXT816(0) << 0x40);
        in_ZMM3 = ZEXT1664(ZEXT816(0) << 0x40);
        in_ZMM5 = ZEXT1664(ZEXT816(0) << 0x40);
        in_ZMM6 = ZEXT1664(ZEXT816(0) << 0x40);
        auVar140 = ZEXT1664(ZEXT816(0) << 0x40);
        lVar74 = lVar53;
        for (iVar49 = iVar54; 0 < iVar49; iVar49 = iVar49 + -1) {
          pfVar64 = (float *)((long)pvVar5 + lVar63 + lVar39);
          fVar100 = *pfVar64;
          fVar83 = pfVar64[1];
          fVar95 = pfVar64[2];
          fVar96 = pfVar64[3];
          fVar97 = pfVar64[4];
          fVar98 = pfVar64[5];
          fVar99 = pfVar64[6];
          pfVar52 = (float *)((long)pvVar57 + lVar63);
          fVar126 = in_ZMM9._28_4_;
          auVar82 = ZEXT3264(CONCAT428(fVar126 + auVar82._28_4_,
                                       CONCAT424(fVar99 * pfVar52[6] + auVar82._24_4_,
                                                 CONCAT420(fVar98 * pfVar52[5] + auVar82._20_4_,
                                                           CONCAT416(fVar97 * pfVar52[4] +
                                                                     auVar82._16_4_,
                                                                     CONCAT412(fVar96 * pfVar52[3] +
                                                                               auVar82._12_4_,
                                                                               CONCAT48(fVar95 * 
                                                  pfVar52[2] + auVar82._8_4_,
                                                  CONCAT44(fVar83 * pfVar52[1] + auVar82._4_4_,
                                                           fVar100 * *pfVar52 + auVar82._0_4_)))))))
                            );
          pfVar52 = (float *)((long)local_228 + lVar63);
          pfVar1 = (float *)((long)local_230 + lVar63);
          auVar94 = ZEXT3264(CONCAT428(fVar126 + auVar94._28_4_,
                                       CONCAT424(fVar99 * pfVar52[6] + auVar94._24_4_,
                                                 CONCAT420(fVar98 * pfVar52[5] + auVar94._20_4_,
                                                           CONCAT416(fVar97 * pfVar52[4] +
                                                                     auVar94._16_4_,
                                                                     CONCAT412(fVar96 * pfVar52[3] +
                                                                               auVar94._12_4_,
                                                                               CONCAT48(fVar95 * 
                                                  pfVar52[2] + auVar94._8_4_,
                                                  CONCAT44(fVar83 * pfVar52[1] + auVar94._4_4_,
                                                           fVar100 * *pfVar52 + auVar94._0_4_)))))))
                            );
          fVar150 = in_ZMM10._28_4_;
          auVar104 = ZEXT3264(CONCAT428(fVar150 + auVar104._28_4_,
                                        CONCAT424(fVar99 * pfVar1[6] + auVar104._24_4_,
                                                  CONCAT420(fVar98 * pfVar1[5] + auVar104._20_4_,
                                                            CONCAT416(fVar97 * pfVar1[4] +
                                                                      auVar104._16_4_,
                                                                      CONCAT412(fVar96 * pfVar1[3] +
                                                                                auVar104._12_4_,
                                                                                CONCAT48(fVar95 * 
                                                  pfVar1[2] + auVar104._8_4_,
                                                  CONCAT44(fVar83 * pfVar1[1] + auVar104._4_4_,
                                                           fVar100 * *pfVar1 + auVar104._0_4_)))))))
                             );
          pfVar52 = (float *)((long)pvVar44 + lVar63);
          auVar125 = ZEXT3264(CONCAT428(fVar126 + auVar125._28_4_,
                                        CONCAT424(fVar99 * pfVar52[6] + auVar125._24_4_,
                                                  CONCAT420(fVar98 * pfVar52[5] + auVar125._20_4_,
                                                            CONCAT416(fVar97 * pfVar52[4] +
                                                                      auVar125._16_4_,
                                                                      CONCAT412(fVar96 * pfVar52[3]
                                                                                + auVar125._12_4_,
                                                                                CONCAT48(fVar95 * 
                                                  pfVar52[2] + auVar125._8_4_,
                                                  CONCAT44(fVar83 * pfVar52[1] + auVar125._4_4_,
                                                           fVar100 * *pfVar52 + auVar125._0_4_))))))
                                       ));
          pfVar52 = (float *)((long)pvVar46 + lVar63);
          in_ZMM3 = ZEXT3264(CONCAT428(fVar126 + in_ZMM3._28_4_,
                                       CONCAT424(fVar99 * pfVar52[6] + in_ZMM3._24_4_,
                                                 CONCAT420(fVar98 * pfVar52[5] + in_ZMM3._20_4_,
                                                           CONCAT416(fVar97 * pfVar52[4] +
                                                                     in_ZMM3._16_4_,
                                                                     CONCAT412(fVar96 * pfVar52[3] +
                                                                               in_ZMM3._12_4_,
                                                                               CONCAT48(fVar95 * 
                                                  pfVar52[2] + in_ZMM3._8_4_,
                                                  CONCAT44(fVar83 * pfVar52[1] + in_ZMM3._4_4_,
                                                           fVar100 * *pfVar52 + in_ZMM3._0_4_)))))))
                            );
          pfVar1 = (float *)((long)pvVar68 + lVar63);
          in_ZMM9 = ZEXT3264(CONCAT428(fVar126,CONCAT424(fVar99 * pfVar1[6],
                                                         CONCAT420(fVar98 * pfVar1[5],
                                                                   CONCAT416(fVar97 * pfVar1[4],
                                                                             CONCAT412(fVar96 * 
                                                  pfVar1[3],
                                                  CONCAT48(fVar95 * pfVar1[2],
                                                           CONCAT44(fVar83 * pfVar1[1],
                                                                    fVar100 * *pfVar1))))))));
          pfVar52 = (float *)((long)pvVar71 + lVar63);
          in_ZMM10 = ZEXT3264(CONCAT428(fVar150,CONCAT424(fVar99 * pfVar52[6],
                                                          CONCAT420(fVar98 * pfVar52[5],
                                                                    CONCAT416(fVar97 * pfVar52[4],
                                                                              CONCAT412(fVar96 * 
                                                  pfVar52[3],
                                                  CONCAT48(fVar95 * pfVar52[2],
                                                           CONCAT44(fVar83 * pfVar52[1],
                                                                    fVar100 * *pfVar52))))))));
          in_ZMM5 = ZEXT3264(CONCAT428(fVar126 + in_ZMM5._28_4_,
                                       CONCAT424(fVar99 * pfVar1[6] + in_ZMM5._24_4_,
                                                 CONCAT420(fVar98 * pfVar1[5] + in_ZMM5._20_4_,
                                                           CONCAT416(fVar97 * pfVar1[4] +
                                                                     in_ZMM5._16_4_,
                                                                     CONCAT412(fVar96 * pfVar1[3] +
                                                                               in_ZMM5._12_4_,
                                                                               CONCAT48(fVar95 * 
                                                  pfVar1[2] + in_ZMM5._8_4_,
                                                  CONCAT44(fVar83 * pfVar1[1] + in_ZMM5._4_4_,
                                                           fVar100 * *pfVar1 + in_ZMM5._0_4_))))))))
          ;
          in_ZMM6 = ZEXT3264(CONCAT428(fVar150 + in_ZMM6._28_4_,
                                       CONCAT424(fVar99 * pfVar52[6] + in_ZMM6._24_4_,
                                                 CONCAT420(fVar98 * pfVar52[5] + in_ZMM6._20_4_,
                                                           CONCAT416(fVar97 * pfVar52[4] +
                                                                     in_ZMM6._16_4_,
                                                                     CONCAT412(fVar96 * pfVar52[3] +
                                                                               in_ZMM6._12_4_,
                                                                               CONCAT48(fVar95 * 
                                                  pfVar52[2] + in_ZMM6._8_4_,
                                                  CONCAT44(fVar83 * pfVar52[1] + in_ZMM6._4_4_,
                                                           fVar100 * *pfVar52 + in_ZMM6._0_4_)))))))
                            );
          pfVar52 = (float *)((long)pvVar41 + lVar63);
          auVar140 = ZEXT3264(CONCAT428(pfVar64[7] + auVar140._28_4_,
                                        CONCAT424(fVar99 * pfVar52[6] + auVar140._24_4_,
                                                  CONCAT420(fVar98 * pfVar52[5] + auVar140._20_4_,
                                                            CONCAT416(fVar97 * pfVar52[4] +
                                                                      auVar140._16_4_,
                                                                      CONCAT412(fVar96 * pfVar52[3]
                                                                                + auVar140._12_4_,
                                                                                CONCAT48(fVar95 * 
                                                  pfVar52[2] + auVar140._8_4_,
                                                  CONCAT44(fVar83 * pfVar52[1] + auVar140._4_4_,
                                                           fVar100 * *pfVar52 + auVar140._0_4_))))))
                                       ));
          lVar63 = lVar63 + 0x20;
          lVar74 = lVar74 + 0x20;
        }
        pfVar64 = (float *)((long)pvVar5 + lVar63 + lVar39);
        lVar51 = 0;
        lVar63 = lVar60;
        iVar49 = iVar69;
        while( true ) {
          if (iVar49 < 1) break;
          pfVar52 = (float *)((long)pvVar7 + lVar51);
          fVar100 = *pfVar52;
          fVar83 = pfVar52[1];
          fVar95 = pfVar52[2];
          fVar96 = pfVar52[3];
          fVar97 = pfVar52[4];
          fVar98 = pfVar52[5];
          fVar99 = pfVar52[6];
          pfVar1 = (float *)((long)local_288 + lVar51);
          fVar126 = in_ZMM9._28_4_;
          auVar82 = ZEXT3264(CONCAT428(fVar126 + auVar82._28_4_,
                                       CONCAT424(fVar99 * pfVar1[6] + auVar82._24_4_,
                                                 CONCAT420(fVar98 * pfVar1[5] + auVar82._20_4_,
                                                           CONCAT416(fVar97 * pfVar1[4] +
                                                                     auVar82._16_4_,
                                                                     CONCAT412(fVar96 * pfVar1[3] +
                                                                               auVar82._12_4_,
                                                                               CONCAT48(fVar95 * 
                                                  pfVar1[2] + auVar82._8_4_,
                                                  CONCAT44(fVar83 * pfVar1[1] + auVar82._4_4_,
                                                           fVar100 * *pfVar1 + auVar82._0_4_))))))))
          ;
          pfVar1 = (float *)((long)local_290 + lVar51);
          pfVar2 = (float *)((long)local_298 + lVar51);
          auVar94 = ZEXT3264(CONCAT428(fVar126 + auVar94._28_4_,
                                       CONCAT424(fVar99 * pfVar1[6] + auVar94._24_4_,
                                                 CONCAT420(fVar98 * pfVar1[5] + auVar94._20_4_,
                                                           CONCAT416(fVar97 * pfVar1[4] +
                                                                     auVar94._16_4_,
                                                                     CONCAT412(fVar96 * pfVar1[3] +
                                                                               auVar94._12_4_,
                                                                               CONCAT48(fVar95 * 
                                                  pfVar1[2] + auVar94._8_4_,
                                                  CONCAT44(fVar83 * pfVar1[1] + auVar94._4_4_,
                                                           fVar100 * *pfVar1 + auVar94._0_4_))))))))
          ;
          fVar150 = in_ZMM10._28_4_;
          auVar104 = ZEXT3264(CONCAT428(fVar150 + auVar104._28_4_,
                                        CONCAT424(fVar99 * pfVar2[6] + auVar104._24_4_,
                                                  CONCAT420(fVar98 * pfVar2[5] + auVar104._20_4_,
                                                            CONCAT416(fVar97 * pfVar2[4] +
                                                                      auVar104._16_4_,
                                                                      CONCAT412(fVar96 * pfVar2[3] +
                                                                                auVar104._12_4_,
                                                                                CONCAT48(fVar95 * 
                                                  pfVar2[2] + auVar104._8_4_,
                                                  CONCAT44(fVar83 * pfVar2[1] + auVar104._4_4_,
                                                           fVar100 * *pfVar2 + auVar104._0_4_)))))))
                             );
          pfVar1 = (float *)((long)local_2a8 + lVar51);
          auVar125 = ZEXT3264(CONCAT428(fVar126 + auVar125._28_4_,
                                        CONCAT424(fVar99 * pfVar1[6] + auVar125._24_4_,
                                                  CONCAT420(fVar98 * pfVar1[5] + auVar125._20_4_,
                                                            CONCAT416(fVar97 * pfVar1[4] +
                                                                      auVar125._16_4_,
                                                                      CONCAT412(fVar96 * pfVar1[3] +
                                                                                auVar125._12_4_,
                                                                                CONCAT48(fVar95 * 
                                                  pfVar1[2] + auVar125._8_4_,
                                                  CONCAT44(fVar83 * pfVar1[1] + auVar125._4_4_,
                                                           fVar100 * *pfVar1 + auVar125._0_4_)))))))
                             );
          pfVar1 = (float *)((long)local_270 + lVar51);
          in_ZMM3 = ZEXT3264(CONCAT428(fVar126 + in_ZMM3._28_4_,
                                       CONCAT424(fVar99 * pfVar1[6] + in_ZMM3._24_4_,
                                                 CONCAT420(fVar98 * pfVar1[5] + in_ZMM3._20_4_,
                                                           CONCAT416(fVar97 * pfVar1[4] +
                                                                     in_ZMM3._16_4_,
                                                                     CONCAT412(fVar96 * pfVar1[3] +
                                                                               in_ZMM3._12_4_,
                                                                               CONCAT48(fVar95 * 
                                                  pfVar1[2] + in_ZMM3._8_4_,
                                                  CONCAT44(fVar83 * pfVar1[1] + in_ZMM3._4_4_,
                                                           fVar100 * *pfVar1 + in_ZMM3._0_4_))))))))
          ;
          pfVar1 = (float *)((long)local_278 + lVar51);
          in_ZMM9 = ZEXT3264(CONCAT428(fVar126,CONCAT424(fVar99 * pfVar1[6],
                                                         CONCAT420(fVar98 * pfVar1[5],
                                                                   CONCAT416(fVar97 * pfVar1[4],
                                                                             CONCAT412(fVar96 * 
                                                  pfVar1[3],
                                                  CONCAT48(fVar95 * pfVar1[2],
                                                           CONCAT44(fVar83 * pfVar1[1],
                                                                    fVar100 * *pfVar1))))))));
          pfVar2 = (float *)((long)local_2a0 + lVar51);
          in_ZMM10 = ZEXT3264(CONCAT428(fVar150,CONCAT424(fVar99 * pfVar2[6],
                                                          CONCAT420(fVar98 * pfVar2[5],
                                                                    CONCAT416(fVar97 * pfVar2[4],
                                                                              CONCAT412(fVar96 * 
                                                  pfVar2[3],
                                                  CONCAT48(fVar95 * pfVar2[2],
                                                           CONCAT44(fVar83 * pfVar2[1],
                                                                    fVar100 * *pfVar2))))))));
          in_ZMM5 = ZEXT3264(CONCAT428(fVar126 + in_ZMM5._28_4_,
                                       CONCAT424(fVar99 * pfVar1[6] + in_ZMM5._24_4_,
                                                 CONCAT420(fVar98 * pfVar1[5] + in_ZMM5._20_4_,
                                                           CONCAT416(fVar97 * pfVar1[4] +
                                                                     in_ZMM5._16_4_,
                                                                     CONCAT412(fVar96 * pfVar1[3] +
                                                                               in_ZMM5._12_4_,
                                                                               CONCAT48(fVar95 * 
                                                  pfVar1[2] + in_ZMM5._8_4_,
                                                  CONCAT44(fVar83 * pfVar1[1] + in_ZMM5._4_4_,
                                                           fVar100 * *pfVar1 + in_ZMM5._0_4_))))))))
          ;
          in_ZMM6 = ZEXT3264(CONCAT428(fVar150 + in_ZMM6._28_4_,
                                       CONCAT424(fVar99 * pfVar2[6] + in_ZMM6._24_4_,
                                                 CONCAT420(fVar98 * pfVar2[5] + in_ZMM6._20_4_,
                                                           CONCAT416(fVar97 * pfVar2[4] +
                                                                     in_ZMM6._16_4_,
                                                                     CONCAT412(fVar96 * pfVar2[3] +
                                                                               in_ZMM6._12_4_,
                                                                               CONCAT48(fVar95 * 
                                                  pfVar2[2] + in_ZMM6._8_4_,
                                                  CONCAT44(fVar83 * pfVar2[1] + in_ZMM6._4_4_,
                                                           fVar100 * *pfVar2 + in_ZMM6._0_4_))))))))
          ;
          pfVar1 = (float *)((long)local_220 + lVar51);
          auVar140 = ZEXT3264(CONCAT428(pfVar52[7] + auVar140._28_4_,
                                        CONCAT424(fVar99 * pfVar1[6] + auVar140._24_4_,
                                                  CONCAT420(fVar98 * pfVar1[5] + auVar140._20_4_,
                                                            CONCAT416(fVar97 * pfVar1[4] +
                                                                      auVar140._16_4_,
                                                                      CONCAT412(fVar96 * pfVar1[3] +
                                                                                auVar140._12_4_,
                                                                                CONCAT48(fVar95 * 
                                                  pfVar1[2] + auVar140._8_4_,
                                                  CONCAT44(fVar83 * pfVar1[1] + auVar140._4_4_,
                                                           fVar100 * *pfVar1 + auVar140._0_4_)))))))
                             );
          iVar49 = iVar49 + -1;
          lVar51 = lVar51 + 0x20;
          lVar63 = lVar63 + 0x20;
        }
        auVar76 = vhaddps_avx(auVar82._0_32_,auVar94._0_32_);
        auVar77 = vhaddps_avx(auVar104._0_32_,auVar125._0_32_);
        auVar77 = vhaddps_avx(auVar76,auVar77);
        auVar76 = vhaddps_avx(in_ZMM3._0_32_,in_ZMM5._0_32_);
        auVar86 = vhaddps_avx(in_ZMM6._0_32_,auVar140._0_32_);
        auVar86 = vhaddps_avx(auVar76,auVar86);
        auVar76 = vblendps_avx(auVar77,auVar86,0xf0);
        auVar77 = vperm2f128_avx(auVar77,auVar86,0x21);
        auVar85 = vinsertps_avx(ZEXT416(*(uint *)((long)pvVar6 + lVar47 * 4)),
                                ZEXT416(*(uint *)((long)pvVar6 + lVar47 * 4 + lVar28)),0x10);
        auVar85 = vinsertps_avx(auVar85,ZEXT416(*(uint *)((long)pvVar6 + lVar47 * 4 + lVar28 * 2)),
                                0x20);
        auVar85 = vinsertps_avx(auVar85,ZEXT416(*(uint *)((long)pvVar6 + lVar47 * 4 + lVar28 * 3)),
                                0x30);
        auVar101 = vinsertps_avx(ZEXT416(*(uint *)((long)pvVar6 + uVar37 * 8)),
                                 ZEXT416(*(uint *)((long)pvVar6 + uVar37 * 8 + lVar28)),0x10);
        auVar101 = vinsertps_avx(auVar101,ZEXT416(*(uint *)((long)pvVar6 + uVar37 * 8 + lVar28 * 2))
                                 ,0x20);
        auVar101 = vinsertps_avx(auVar101,ZEXT416(*(uint *)((long)pvVar6 + uVar37 * 8 + lVar28 * 3))
                                 ,0x30);
        auVar86._16_16_ = auVar85;
        auVar86._0_16_ = auVar101;
        auVar75._0_4_ = auVar76._0_4_ + auVar77._0_4_ + auVar101._0_4_;
        auVar75._4_4_ = auVar76._4_4_ + auVar77._4_4_ + auVar101._4_4_;
        auVar75._8_4_ = auVar76._8_4_ + auVar77._8_4_ + auVar101._8_4_;
        auVar75._12_4_ = auVar76._12_4_ + auVar77._12_4_ + auVar101._12_4_;
        auVar75._16_4_ = auVar76._16_4_ + auVar77._16_4_ + auVar85._0_4_;
        auVar75._20_4_ = auVar76._20_4_ + auVar77._20_4_ + auVar85._4_4_;
        auVar75._24_4_ = auVar76._24_4_ + auVar77._24_4_ + auVar85._8_4_;
        auVar75._28_4_ = auVar76._28_4_ + auVar77._28_4_ + auVar85._12_4_;
        pfVar52 = (float *)(lVar51 + (long)pvVar7);
        for (uVar25 = uVar42; uVar26 = uVar55, 0 < (int)uVar25; uVar25 = uVar25 - 1) {
          auVar85 = vinsertps_avx(ZEXT416(*(uint *)((long)pvVar65 + lVar72 + lVar74)),
                                  ZEXT416(*(uint *)((long)pvVar36 + lVar74)),0x10);
          auVar85 = vinsertps_avx(auVar85,ZEXT416(*(uint *)((long)pvVar35 + lVar74)),0x20);
          auVar85 = vinsertps_avx(auVar85,ZEXT416(*(uint *)((long)pvVar34 + lVar74)),0x30);
          auVar101 = vinsertps_avx(ZEXT416(*(uint *)((long)pvVar65 + lVar74)),
                                   ZEXT416(*(uint *)((long)pvVar73 + lVar74)),0x10);
          auVar101 = vinsertps_avx(auVar101,ZEXT416(*(uint *)((long)pvVar45 + lVar74)),0x20);
          auVar101 = vinsertps_avx(auVar101,ZEXT416(*(uint *)((long)pvVar70 + lVar74)),0x30);
          fVar100 = *pfVar64;
          fVar83 = auVar101._0_4_ * fVar100;
          fVar95 = auVar101._4_4_ * fVar100;
          auVar86._4_4_ = fVar95;
          auVar86._0_4_ = fVar83;
          fVar96 = auVar101._8_4_ * fVar100;
          auVar86._8_4_ = fVar96;
          fVar97 = auVar101._12_4_ * fVar100;
          auVar86._12_4_ = fVar97;
          fVar98 = auVar85._0_4_ * fVar100;
          auVar86._16_4_ = fVar98;
          fVar99 = auVar85._4_4_ * fVar100;
          auVar86._20_4_ = fVar99;
          fVar100 = auVar85._8_4_ * fVar100;
          auVar86._24_4_ = fVar100;
          auVar86._28_4_ = auVar85._12_4_;
          auVar76._0_4_ = fVar83 + auVar75._0_4_;
          auVar76._4_4_ = fVar95 + auVar75._4_4_;
          auVar76._8_4_ = fVar96 + auVar75._8_4_;
          auVar76._12_4_ = fVar97 + auVar75._12_4_;
          auVar76._16_4_ = fVar98 + auVar75._16_4_;
          auVar76._20_4_ = fVar99 + auVar75._20_4_;
          auVar76._24_4_ = fVar100 + auVar75._24_4_;
          auVar76._28_4_ = auVar85._12_4_ + auVar75._28_4_;
          pfVar64 = pfVar64 + 1;
          lVar74 = lVar74 + 4;
          auVar75 = auVar76;
        }
        while( true ) {
          in_ZMM1 = ZEXT3264(auVar86);
          if ((int)uVar26 < 1) break;
          auVar85 = vinsertps_avx(ZEXT416(*(uint *)((long)pvVar67 + lVar61 + lVar63)),
                                  ZEXT416(*(uint *)((long)pvVar66 + lVar63)),0x10);
          auVar85 = vinsertps_avx(auVar85,ZEXT416(*(uint *)((long)pvVar48 + lVar63)),0x20);
          auVar85 = vinsertps_avx(auVar85,ZEXT416(*(uint *)((long)pvVar59 + lVar63)),0x30);
          auVar101 = vinsertps_avx(ZEXT416(*(uint *)((long)pvVar67 + lVar63)),
                                   ZEXT416(*(uint *)((long)pvVar62 + lVar63)),0x10);
          auVar101 = vinsertps_avx(auVar101,ZEXT416(*(uint *)((long)pvVar40 + lVar63)),0x20);
          auVar101 = vinsertps_avx(auVar101,ZEXT416(*(uint *)((long)pvVar43 + lVar63)),0x30);
          fVar100 = *pfVar52;
          fVar83 = auVar101._0_4_ * fVar100;
          fVar95 = auVar101._4_4_ * fVar100;
          auVar86._4_4_ = fVar95;
          auVar86._0_4_ = fVar83;
          fVar96 = auVar101._8_4_ * fVar100;
          auVar86._8_4_ = fVar96;
          fVar97 = auVar101._12_4_ * fVar100;
          auVar86._12_4_ = fVar97;
          fVar98 = auVar85._0_4_ * fVar100;
          auVar86._16_4_ = fVar98;
          fVar99 = auVar85._4_4_ * fVar100;
          auVar86._20_4_ = fVar99;
          fVar100 = auVar85._8_4_ * fVar100;
          auVar86._24_4_ = fVar100;
          auVar86._28_4_ = auVar85._12_4_;
          auVar77._0_4_ = fVar83 + auVar75._0_4_;
          auVar77._4_4_ = fVar95 + auVar75._4_4_;
          auVar77._8_4_ = fVar96 + auVar75._8_4_;
          auVar77._12_4_ = fVar97 + auVar75._12_4_;
          auVar77._16_4_ = fVar98 + auVar75._16_4_;
          auVar77._20_4_ = fVar99 + auVar75._20_4_;
          auVar77._24_4_ = fVar100 + auVar75._24_4_;
          auVar77._28_4_ = auVar85._12_4_ + auVar75._28_4_;
          pfVar52 = pfVar52 + 1;
          lVar63 = lVar63 + 4;
          uVar26 = uVar26 - 1;
          auVar75 = auVar77;
        }
        *(float *)&((Allocator *)((long)local_78.data + uVar37 * 8))->_vptr_Allocator =
             auVar75._0_4_;
        auVar85 = auVar75._0_16_;
        uVar4 = vextractps_avx(auVar85,1);
        *(undefined4 *)
         ((long)&((Allocator *)((long)local_78.data + uVar37 * 8))->_vptr_Allocator + lVar29) =
             uVar4;
        uVar4 = vextractps_avx(auVar85,2);
        *(undefined4 *)
         ((long)&((Allocator *)((long)local_78.data + uVar37 * 8))->_vptr_Allocator + lVar29 * 2) =
             uVar4;
        uVar4 = vextractps_avx(auVar85,3);
        *(undefined4 *)
         ((long)&((Allocator *)((long)local_78.data + uVar37 * 8))->_vptr_Allocator + lVar29 * 3) =
             uVar4;
        auVar85 = auVar75._16_16_;
        *(float *)((long)&((Allocator *)((long)local_78.data + uVar37 * 8))->_vptr_Allocator + 4) =
             auVar75._16_4_;
        uVar4 = vextractps_avx(auVar85,1);
        *(undefined4 *)
         ((long)&((Allocator *)((long)local_78.data + uVar37 * 8))->_vptr_Allocator + lVar29 + 4) =
             uVar4;
        uVar4 = vextractps_avx(auVar85,2);
        *(undefined4 *)
         ((long)&((Allocator *)((long)local_78.data + uVar37 * 8))->_vptr_Allocator + lVar29 * 2 + 4
         ) = uVar4;
        uVar4 = vextractps_avx(auVar85,3);
        *(undefined4 *)
         ((long)&((Allocator *)((long)local_78.data + uVar37 * 8))->_vptr_Allocator + lVar29 * 3 + 4
         ) = uVar4;
        pvVar41 = (void *)((long)pvVar41 + lVar30);
        pvVar71 = (void *)((long)pvVar71 + lVar30);
        pvVar68 = (void *)((long)pvVar68 + lVar30);
        pvVar46 = (void *)((long)pvVar46 + lVar30);
        pvVar44 = (void *)((long)pvVar44 + lVar30);
        local_230 = (void *)((long)local_230 + lVar30);
        local_228 = (void *)((long)local_228 + lVar30);
        pvVar57 = (void *)((long)pvVar57 + lVar30);
        local_220 = (void *)((long)local_220 + lVar31);
        local_2a0 = (void *)((long)local_2a0 + lVar31);
        local_278 = (void *)((long)local_278 + lVar31);
        local_270 = (void *)((long)local_270 + lVar31);
        local_2a8 = (void *)((long)local_2a8 + lVar31);
        local_298 = (void *)((long)local_298 + lVar31);
        local_290 = (void *)((long)local_290 + lVar31);
        local_288 = (void *)((long)local_288 + lVar31);
        lVar53 = lVar53 + lVar30;
        lVar60 = lVar60 + lVar31;
      }
      lVar29 = bottom_blob->w * lVar27 * bottom_blob->elemsize;
      pvVar5 = bottom_blob->data;
      pvVar6 = bias_c->data;
      lVar30 = (long)bias_c->w * bias_c->elemsize;
      pvVar65 = weight_xc->data;
      pvVar67 = weight_hc->data;
      lVar39 = (long)weight_xc->w * weight_xc->elemsize;
      pvVar43 = (void *)(lVar39 * uVar50 + (long)pvVar65);
      pvVar45 = (void *)(lVar39 * (uVar38 + uVar50) + (long)pvVar65);
      pvVar48 = (void *)(lVar39 * (lVar56 + uVar50) + (long)pvVar65);
      lVar60 = (long)weight_hc->w * weight_hc->elemsize;
      pvVar65 = (void *)(lVar39 * (lVar58 + uVar50) + (long)pvVar65);
      pvVar36 = (void *)(lVar60 * uVar50 + (long)pvVar67);
      pvVar40 = (void *)(lVar60 * (uVar38 + uVar50) + (long)pvVar67);
      pvVar59 = (void *)(lVar60 * (lVar56 + uVar50) + (long)pvVar67);
      pvVar67 = (void *)(lVar60 * (lVar58 + uVar50) + (long)pvVar67);
      lVar31 = (long)local_78.w * local_78.elemsize;
      pvVar7 = hidden_state->data;
      lVar28 = 0;
      lVar53 = 0;
      pvVar41 = pvVar36;
      pvVar44 = pvVar43;
      pvVar46 = pvVar45;
      pvVar57 = pvVar48;
      pvVar68 = pvVar65;
      pvVar71 = pvVar67;
      pvVar34 = pvVar40;
      pvVar35 = pvVar59;
      for (uVar37 = uVar50; (long)uVar37 < (long)uVar38; uVar37 = uVar37 + 1) {
        auVar82 = ZEXT1664(ZEXT816(0) << 0x40);
        lVar72 = 0;
        auVar94 = ZEXT1664(ZEXT816(0) << 0x40);
        auVar104 = ZEXT1664(ZEXT816(0) << 0x40);
        in_ZMM3 = ZEXT1664(ZEXT816(0) << 0x40);
        lVar61 = lVar28;
        for (iVar49 = iVar54; 0 < iVar49; iVar49 = iVar49 + -1) {
          pfVar64 = (float *)((long)pvVar5 + lVar72 + lVar29);
          fVar100 = *pfVar64;
          fVar83 = pfVar64[1];
          fVar95 = pfVar64[2];
          fVar96 = pfVar64[3];
          fVar97 = pfVar64[4];
          fVar98 = pfVar64[5];
          fVar99 = pfVar64[6];
          pfVar52 = (float *)((long)pvVar44 + lVar72);
          fVar126 = in_ZMM5._28_4_;
          auVar82 = ZEXT3264(CONCAT428(fVar126 + auVar82._28_4_,
                                       CONCAT424(fVar99 * pfVar52[6] + auVar82._24_4_,
                                                 CONCAT420(fVar98 * pfVar52[5] + auVar82._20_4_,
                                                           CONCAT416(fVar97 * pfVar52[4] +
                                                                     auVar82._16_4_,
                                                                     CONCAT412(fVar96 * pfVar52[3] +
                                                                               auVar82._12_4_,
                                                                               CONCAT48(fVar95 * 
                                                  pfVar52[2] + auVar82._8_4_,
                                                  CONCAT44(fVar83 * pfVar52[1] + auVar82._4_4_,
                                                           fVar100 * *pfVar52 + auVar82._0_4_)))))))
                            );
          pfVar52 = (float *)((long)pvVar46 + lVar72);
          in_ZMM5 = ZEXT3264(CONCAT428(fVar126,CONCAT424(fVar99 * pfVar52[6],
                                                         CONCAT420(fVar98 * pfVar52[5],
                                                                   CONCAT416(fVar97 * pfVar52[4],
                                                                             CONCAT412(fVar96 * 
                                                  pfVar52[3],
                                                  CONCAT48(fVar95 * pfVar52[2],
                                                           CONCAT44(fVar83 * pfVar52[1],
                                                                    fVar100 * *pfVar52))))))));
          pfVar1 = (float *)((long)pvVar57 + lVar72);
          auVar125._0_4_ = fVar100 * *pfVar1;
          auVar125._4_4_ = fVar83 * pfVar1[1];
          auVar125._8_4_ = fVar95 * pfVar1[2];
          auVar125._12_4_ = fVar96 * pfVar1[3];
          auVar125._16_4_ = fVar97 * pfVar1[4];
          auVar125._20_4_ = fVar98 * pfVar1[5];
          auVar125._28_36_ = in_ZMM6._28_36_;
          auVar125._24_4_ = fVar99 * pfVar1[6];
          auVar94 = ZEXT3264(CONCAT428(fVar126 + auVar94._28_4_,
                                       CONCAT424(fVar99 * pfVar52[6] + auVar94._24_4_,
                                                 CONCAT420(fVar98 * pfVar52[5] + auVar94._20_4_,
                                                           CONCAT416(fVar97 * pfVar52[4] +
                                                                     auVar94._16_4_,
                                                                     CONCAT412(fVar96 * pfVar52[3] +
                                                                               auVar94._12_4_,
                                                                               CONCAT48(fVar95 * 
                                                  pfVar52[2] + auVar94._8_4_,
                                                  CONCAT44(fVar83 * pfVar52[1] + auVar94._4_4_,
                                                           fVar100 * *pfVar52 + auVar94._0_4_)))))))
                            );
          auVar104 = ZEXT3264(CONCAT428(in_ZMM6._28_4_ + auVar104._28_4_,
                                        CONCAT424(auVar125._24_4_ + auVar104._24_4_,
                                                  CONCAT420(auVar125._20_4_ + auVar104._20_4_,
                                                            CONCAT416(auVar125._16_4_ +
                                                                      auVar104._16_4_,
                                                                      CONCAT412(auVar125._12_4_ +
                                                                                auVar104._12_4_,
                                                                                CONCAT48(auVar125.
                                                  _8_4_ + auVar104._8_4_,
                                                  CONCAT44(auVar125._4_4_ + auVar104._4_4_,
                                                           auVar125._0_4_ + auVar104._0_4_))))))));
          pfVar52 = (float *)((long)pvVar68 + lVar72);
          in_ZMM3 = ZEXT3264(CONCAT428(pfVar64[7] + in_ZMM3._28_4_,
                                       CONCAT424(fVar99 * pfVar52[6] + in_ZMM3._24_4_,
                                                 CONCAT420(fVar98 * pfVar52[5] + in_ZMM3._20_4_,
                                                           CONCAT416(fVar97 * pfVar52[4] +
                                                                     in_ZMM3._16_4_,
                                                                     CONCAT412(fVar96 * pfVar52[3] +
                                                                               in_ZMM3._12_4_,
                                                                               CONCAT48(fVar95 * 
                                                  pfVar52[2] + in_ZMM3._8_4_,
                                                  CONCAT44(fVar83 * pfVar52[1] + in_ZMM3._4_4_,
                                                           fVar100 * *pfVar52 + in_ZMM3._0_4_)))))))
                            );
          lVar72 = lVar72 + 0x20;
          lVar61 = lVar61 + 0x20;
          in_ZMM6 = ZEXT3264(auVar125._0_32_);
        }
        pfVar64 = (float *)((long)pvVar5 + lVar72 + lVar29);
        lVar47 = 0;
        lVar72 = lVar53;
        iVar49 = iVar69;
        while( true ) {
          if (iVar49 < 1) break;
          pfVar2 = (float *)((long)pvVar7 + lVar47);
          fVar100 = *pfVar2;
          fVar83 = pfVar2[1];
          fVar95 = pfVar2[2];
          fVar96 = pfVar2[3];
          fVar97 = pfVar2[4];
          fVar98 = pfVar2[5];
          fVar99 = pfVar2[6];
          pfVar52 = (float *)((long)pvVar41 + lVar47);
          fVar126 = in_ZMM5._28_4_;
          auVar82 = ZEXT3264(CONCAT428(fVar126 + auVar82._28_4_,
                                       CONCAT424(fVar99 * pfVar52[6] + auVar82._24_4_,
                                                 CONCAT420(fVar98 * pfVar52[5] + auVar82._20_4_,
                                                           CONCAT416(fVar97 * pfVar52[4] +
                                                                     auVar82._16_4_,
                                                                     CONCAT412(fVar96 * pfVar52[3] +
                                                                               auVar82._12_4_,
                                                                               CONCAT48(fVar95 * 
                                                  pfVar52[2] + auVar82._8_4_,
                                                  CONCAT44(fVar83 * pfVar52[1] + auVar82._4_4_,
                                                           fVar100 * *pfVar52 + auVar82._0_4_)))))))
                            );
          pfVar52 = (float *)((long)pvVar34 + lVar47);
          in_ZMM5 = ZEXT3264(CONCAT428(fVar126,CONCAT424(fVar99 * pfVar52[6],
                                                         CONCAT420(fVar98 * pfVar52[5],
                                                                   CONCAT416(fVar97 * pfVar52[4],
                                                                             CONCAT412(fVar96 * 
                                                  pfVar52[3],
                                                  CONCAT48(fVar95 * pfVar52[2],
                                                           CONCAT44(fVar83 * pfVar52[1],
                                                                    fVar100 * *pfVar52))))))));
          pfVar1 = (float *)((long)pvVar35 + lVar47);
          auVar140._0_4_ = fVar100 * *pfVar1;
          auVar140._4_4_ = fVar83 * pfVar1[1];
          auVar140._8_4_ = fVar95 * pfVar1[2];
          auVar140._12_4_ = fVar96 * pfVar1[3];
          auVar140._16_4_ = fVar97 * pfVar1[4];
          auVar140._20_4_ = fVar98 * pfVar1[5];
          auVar140._28_36_ = in_ZMM6._28_36_;
          auVar140._24_4_ = fVar99 * pfVar1[6];
          auVar94 = ZEXT3264(CONCAT428(fVar126 + auVar94._28_4_,
                                       CONCAT424(fVar99 * pfVar52[6] + auVar94._24_4_,
                                                 CONCAT420(fVar98 * pfVar52[5] + auVar94._20_4_,
                                                           CONCAT416(fVar97 * pfVar52[4] +
                                                                     auVar94._16_4_,
                                                                     CONCAT412(fVar96 * pfVar52[3] +
                                                                               auVar94._12_4_,
                                                                               CONCAT48(fVar95 * 
                                                  pfVar52[2] + auVar94._8_4_,
                                                  CONCAT44(fVar83 * pfVar52[1] + auVar94._4_4_,
                                                           fVar100 * *pfVar52 + auVar94._0_4_)))))))
                            );
          auVar104 = ZEXT3264(CONCAT428(in_ZMM6._28_4_ + auVar104._28_4_,
                                        CONCAT424(auVar140._24_4_ + auVar104._24_4_,
                                                  CONCAT420(auVar140._20_4_ + auVar104._20_4_,
                                                            CONCAT416(auVar140._16_4_ +
                                                                      auVar104._16_4_,
                                                                      CONCAT412(auVar140._12_4_ +
                                                                                auVar104._12_4_,
                                                                                CONCAT48(auVar140.
                                                  _8_4_ + auVar104._8_4_,
                                                  CONCAT44(auVar140._4_4_ + auVar104._4_4_,
                                                           auVar140._0_4_ + auVar104._0_4_))))))));
          pfVar52 = (float *)((long)pvVar71 + lVar47);
          in_ZMM3 = ZEXT3264(CONCAT428(pfVar2[7] + in_ZMM3._28_4_,
                                       CONCAT424(fVar99 * pfVar52[6] + in_ZMM3._24_4_,
                                                 CONCAT420(fVar98 * pfVar52[5] + in_ZMM3._20_4_,
                                                           CONCAT416(fVar97 * pfVar52[4] +
                                                                     in_ZMM3._16_4_,
                                                                     CONCAT412(fVar96 * pfVar52[3] +
                                                                               in_ZMM3._12_4_,
                                                                               CONCAT48(fVar95 * 
                                                  pfVar52[2] + in_ZMM3._8_4_,
                                                  CONCAT44(fVar83 * pfVar52[1] + in_ZMM3._4_4_,
                                                           fVar100 * *pfVar52 + in_ZMM3._0_4_)))))))
                            );
          iVar49 = iVar49 + -1;
          lVar47 = lVar47 + 0x20;
          lVar72 = lVar72 + 0x20;
          in_ZMM6 = ZEXT3264(auVar140._0_32_);
        }
        auVar76 = vhaddps_avx(auVar82._0_32_,auVar94._0_32_);
        auVar77 = vhaddps_avx(auVar104._0_32_,in_ZMM3._0_32_);
        auVar76 = vhaddps_avx(auVar76,auVar77);
        auVar101 = auVar76._16_16_;
        auVar85 = vinsertps_avx(ZEXT416(*(uint *)((long)pvVar6 + uVar37 * 4)),
                                ZEXT416(*(uint *)((long)pvVar6 + uVar37 * 4 + lVar30)),0x10);
        auVar85 = vinsertps_avx(auVar85,ZEXT416(*(uint *)((long)pvVar6 + uVar37 * 4 + lVar30 * 2)),
                                0x20);
        auVar85 = vinsertps_avx(auVar85,ZEXT416(*(uint *)((long)pvVar6 + uVar37 * 4 + lVar30 * 3)),
                                0x30);
        auVar107._0_4_ = auVar85._0_4_ + auVar76._0_4_ + auVar76._16_4_;
        auVar107._4_4_ = auVar85._4_4_ + auVar76._4_4_ + auVar76._20_4_;
        auVar107._8_4_ = auVar85._8_4_ + auVar76._8_4_ + auVar76._24_4_;
        auVar107._12_4_ = auVar85._12_4_ + auVar76._12_4_ + auVar76._28_4_;
        pfVar52 = (float *)(lVar47 + (long)pvVar7);
        for (uVar25 = uVar42; uVar26 = uVar55, 0 < (int)uVar25; uVar25 = uVar25 - 1) {
          auVar85 = vinsertps_avx(ZEXT416(*(uint *)((long)pvVar43 + lVar61)),
                                  ZEXT416(*(uint *)((long)pvVar45 + lVar61)),0x10);
          auVar85 = vinsertps_avx(auVar85,ZEXT416(*(uint *)((long)pvVar48 + lVar61)),0x20);
          auVar85 = vinsertps_avx(auVar85,ZEXT416(*(uint *)((long)pvVar65 + lVar61)),0x30);
          fVar100 = *pfVar64;
          auVar101._0_4_ = auVar85._0_4_ * fVar100;
          auVar101._4_4_ = auVar85._4_4_ * fVar100;
          auVar101._8_4_ = auVar85._8_4_ * fVar100;
          auVar101._12_4_ = auVar85._12_4_ * fVar100;
          auVar85._0_4_ = auVar101._0_4_ + auVar107._0_4_;
          auVar85._4_4_ = auVar101._4_4_ + auVar107._4_4_;
          auVar85._8_4_ = auVar101._8_4_ + auVar107._8_4_;
          auVar85._12_4_ = auVar101._12_4_ + auVar107._12_4_;
          pfVar64 = pfVar64 + 1;
          lVar61 = lVar61 + 4;
          auVar107 = auVar85;
        }
        while( true ) {
          in_ZMM1 = ZEXT1664(auVar101);
          if ((int)uVar26 < 1) break;
          auVar85 = vinsertps_avx(ZEXT416(*(uint *)((long)pvVar36 + lVar72)),
                                  ZEXT416(*(uint *)((long)pvVar40 + lVar72)),0x10);
          auVar85 = vinsertps_avx(auVar85,ZEXT416(*(uint *)((long)pvVar59 + lVar72)),0x20);
          auVar85 = vinsertps_avx(auVar85,ZEXT416(*(uint *)((long)pvVar67 + lVar72)),0x30);
          fVar100 = *pfVar52;
          auVar101._0_4_ = auVar85._0_4_ * fVar100;
          auVar101._4_4_ = auVar85._4_4_ * fVar100;
          auVar101._8_4_ = auVar85._8_4_ * fVar100;
          auVar101._12_4_ = auVar85._12_4_ * fVar100;
          auVar119._0_4_ = auVar101._0_4_ + auVar107._0_4_;
          auVar119._4_4_ = auVar101._4_4_ + auVar107._4_4_;
          auVar119._8_4_ = auVar101._8_4_ + auVar107._8_4_;
          auVar119._12_4_ = auVar101._12_4_ + auVar107._12_4_;
          pfVar52 = pfVar52 + 1;
          lVar72 = lVar72 + 4;
          uVar26 = uVar26 - 1;
          auVar107 = auVar119;
        }
        *(float *)((long)(_func_int ***)local_78.data + uVar37 * 4) = auVar107._0_4_;
        uVar4 = vextractps_avx(auVar107,1);
        *(undefined4 *)((long)(_func_int ***)local_78.data + uVar37 * 4 + lVar31) = uVar4;
        uVar4 = vextractps_avx(auVar107,2);
        *(undefined4 *)((long)(_func_int ***)local_78.data + uVar37 * 4 + lVar31 * 2) = uVar4;
        uVar4 = vextractps_avx(auVar107,3);
        *(undefined4 *)((long)(_func_int ***)local_78.data + uVar37 * 4 + lVar31 * 3) = uVar4;
        pvVar44 = (void *)((long)pvVar44 + lVar39);
        pvVar46 = (void *)((long)pvVar46 + lVar39);
        pvVar57 = (void *)((long)pvVar57 + lVar39);
        pvVar68 = (void *)((long)pvVar68 + lVar39);
        pvVar41 = (void *)((long)pvVar41 + lVar60);
        pvVar34 = (void *)((long)pvVar34 + lVar60);
        pvVar35 = (void *)((long)pvVar35 + lVar60);
        pvVar71 = (void *)((long)pvVar71 + lVar60);
        lVar28 = lVar28 + lVar39;
        lVar53 = lVar53 + lVar60;
      }
      lVar31 = top_blob->w * lVar27 * top_blob->elemsize;
      pvVar5 = top_blob->data;
      pvVar6 = cell_state->data;
      pvVar65 = hidden_state->data;
      lVar30 = (long)local_78.w * local_78.elemsize;
      lVar27 = 0;
      for (iVar49 = iVar69; uVar25 = uVar55, 0 < iVar49; iVar49 = iVar49 + -1) {
        auVar76 = *(undefined1 (*) [32])((long)(_func_int ***)local_78.data + lVar27);
        auVar78._0_8_ = auVar76._0_8_ ^ 0x8000000080000000;
        auVar78._8_4_ = auVar76._8_4_ ^ 0x80000000;
        auVar78._12_4_ = auVar76._12_4_ ^ 0x80000000;
        auVar78._16_4_ = auVar76._16_4_ ^ 0x80000000;
        auVar78._20_4_ = auVar76._20_4_ ^ 0x80000000;
        auVar78._24_4_ = auVar76._24_4_ ^ 0x80000000;
        auVar78._28_4_ = auVar76._28_4_ ^ 0x80000000;
        auVar141._8_4_ = 0x42b0c0a5;
        auVar141._0_8_ = 0x42b0c0a542b0c0a5;
        auVar141._12_4_ = 0x42b0c0a5;
        auVar141._16_4_ = 0x42b0c0a5;
        auVar141._20_4_ = 0x42b0c0a5;
        auVar141._24_4_ = 0x42b0c0a5;
        auVar141._28_4_ = 0x42b0c0a5;
        auVar76 = vminps_avx(auVar141,auVar78);
        auVar142._8_4_ = 0xc2b0c0a5;
        auVar142._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar142._12_4_ = 0xc2b0c0a5;
        auVar142._16_4_ = 0xc2b0c0a5;
        auVar142._20_4_ = 0xc2b0c0a5;
        auVar142._24_4_ = 0xc2b0c0a5;
        auVar142._28_4_ = 0xc2b0c0a5;
        auVar77 = vmaxps_avx(auVar142,auVar76);
        auVar87._0_4_ = auVar77._0_4_ * 1.442695 + 0.5;
        auVar87._4_4_ = auVar77._4_4_ * 1.442695 + 0.5;
        auVar87._8_4_ = auVar77._8_4_ * 1.442695 + 0.5;
        auVar87._12_4_ = auVar77._12_4_ * 1.442695 + 0.5;
        auVar87._16_4_ = auVar77._16_4_ * 1.442695 + 0.5;
        auVar87._20_4_ = auVar77._20_4_ * 1.442695 + 0.5;
        auVar87._24_4_ = auVar77._24_4_ * 1.442695 + 0.5;
        auVar87._28_4_ = in_ZMM1._28_4_ + 0.5;
        auVar86 = vroundps_avx(auVar87,1);
        auVar76 = vcmpps_avx(auVar87,auVar86,1);
        auVar158._8_4_ = 0x3f800000;
        auVar158._0_8_ = 0x3f8000003f800000;
        auVar158._12_4_ = 0x3f800000;
        auVar158._16_4_ = 0x3f800000;
        auVar158._20_4_ = 0x3f800000;
        auVar158._24_4_ = 0x3f800000;
        auVar158._28_4_ = 0x3f800000;
        auVar76 = vandps_avx(auVar158,auVar76);
        auVar76 = vsubps_avx(auVar86,auVar76);
        auVar10._4_4_ = auVar76._4_4_ * 0.6931472;
        auVar10._0_4_ = auVar76._0_4_ * 0.6931472;
        auVar10._8_4_ = auVar76._8_4_ * 0.6931472;
        auVar10._12_4_ = auVar76._12_4_ * 0.6931472;
        auVar10._16_4_ = auVar76._16_4_ * 0.6931472;
        auVar10._20_4_ = auVar76._20_4_ * 0.6931472;
        auVar10._24_4_ = auVar76._24_4_ * 0.6931472;
        auVar10._28_4_ = auVar86._28_4_;
        auVar77 = vsubps_avx(auVar77,auVar10);
        fVar100 = auVar77._0_4_;
        fVar83 = auVar77._4_4_;
        fVar95 = auVar77._8_4_;
        fVar96 = auVar77._12_4_;
        fVar97 = auVar77._16_4_;
        fVar98 = auVar77._20_4_;
        fVar99 = auVar77._24_4_;
        auVar84._0_4_ = (int)auVar76._0_4_;
        auVar84._4_4_ = (int)auVar76._4_4_;
        auVar84._8_4_ = (int)auVar76._8_4_;
        auVar84._12_4_ = (int)auVar76._12_4_;
        auVar88._16_4_ = (int)auVar76._16_4_;
        auVar88._0_16_ = auVar84;
        auVar88._20_4_ = (int)auVar76._20_4_;
        auVar88._24_4_ = (int)auVar76._24_4_;
        auVar88._28_4_ = (int)auVar76._28_4_;
        auVar101 = vpslld_avx(auVar84,0x17);
        auVar85 = vpslld_avx(auVar88._16_16_,0x17);
        auVar139._8_4_ = 0x3f800000;
        auVar139._0_8_ = 0x3f8000003f800000;
        auVar139._12_4_ = 0x3f800000;
        auVar85 = vpaddd_avx(auVar85,auVar139);
        auVar101 = vpaddd_avx(auVar101,auVar139);
        auVar102._0_4_ =
             (fVar100 + 1.0 +
             fVar100 * fVar100 *
             (((((fVar100 * 0.00019875691 + 0.0013981999) * fVar100 + 0.008333452) * fVar100 +
               0.041665796) * fVar100 + 0.16666666) * fVar100 + 0.5)) * auVar101._0_4_ + 1.0;
        auVar102._4_4_ =
             (fVar83 + 1.0 +
             fVar83 * fVar83 *
             (((((fVar83 * 0.00019875691 + 0.0013981999) * fVar83 + 0.008333452) * fVar83 +
               0.041665796) * fVar83 + 0.16666666) * fVar83 + 0.5)) * auVar101._4_4_ + 1.0;
        auVar102._8_4_ =
             (fVar95 + 1.0 +
             fVar95 * fVar95 *
             (((((fVar95 * 0.00019875691 + 0.0013981999) * fVar95 + 0.008333452) * fVar95 +
               0.041665796) * fVar95 + 0.16666666) * fVar95 + 0.5)) * auVar101._8_4_ + 1.0;
        auVar102._12_4_ =
             (fVar96 + 1.0 +
             fVar96 * fVar96 *
             (((((fVar96 * 0.00019875691 + 0.0013981999) * fVar96 + 0.008333452) * fVar96 +
               0.041665796) * fVar96 + 0.16666666) * fVar96 + 0.5)) * auVar101._12_4_ + 1.0;
        auVar102._16_4_ =
             (fVar97 + 1.0 +
             fVar97 * fVar97 *
             (((((fVar97 * 0.00019875691 + 0.0013981999) * fVar97 + 0.008333452) * fVar97 +
               0.041665796) * fVar97 + 0.16666666) * fVar97 + 0.5)) * auVar85._0_4_ + 1.0;
        auVar102._20_4_ =
             (fVar98 + 1.0 +
             fVar98 * fVar98 *
             (((((fVar98 * 0.00019875691 + 0.0013981999) * fVar98 + 0.008333452) * fVar98 +
               0.041665796) * fVar98 + 0.16666666) * fVar98 + 0.5)) * auVar85._4_4_ + 1.0;
        auVar102._24_4_ =
             (fVar99 + 1.0 +
             fVar99 * fVar99 *
             (((((fVar99 * 0.00019875691 + 0.0013981999) * fVar99 + 0.008333452) * fVar99 +
               0.041665796) * fVar99 + 0.16666666) * fVar99 + 0.5)) * auVar85._8_4_ + 1.0;
        auVar102._28_4_ = auVar77._28_4_ + 1.0 + auVar86._28_4_ + 1.0;
        auVar86 = vrcpps_avx(auVar102);
        pfVar64 = (float *)((long)(_func_int ***)local_78.data + lVar27 + lVar30 * 3);
        auVar11._4_4_ = pfVar64[1] * -2.0;
        auVar11._0_4_ = *pfVar64 * -2.0;
        auVar11._8_4_ = pfVar64[2] * -2.0;
        auVar11._12_4_ = pfVar64[3] * -2.0;
        auVar11._16_4_ = pfVar64[4] * -2.0;
        auVar11._20_4_ = pfVar64[5] * -2.0;
        auVar11._24_4_ = pfVar64[6] * -2.0;
        auVar11._28_4_ = 0xc0000000;
        auVar76 = vminps_avx(auVar141,auVar11);
        auVar77 = vmaxps_avx(auVar76,auVar142);
        auVar108._0_4_ = auVar77._0_4_ * 1.442695 + 0.5;
        auVar108._4_4_ = auVar77._4_4_ * 1.442695 + 0.5;
        auVar108._8_4_ = auVar77._8_4_ * 1.442695 + 0.5;
        auVar108._12_4_ = auVar77._12_4_ * 1.442695 + 0.5;
        auVar108._16_4_ = auVar77._16_4_ * 1.442695 + 0.5;
        auVar108._20_4_ = auVar77._20_4_ * 1.442695 + 0.5;
        auVar108._24_4_ = auVar77._24_4_ * 1.442695 + 0.5;
        auVar108._28_4_ =
             in_ZMM3._28_4_ + 0.0013981999 + 0.008333452 + 0.041665796 + 0.16666666 + 0.5 + 0.5;
        auVar75 = vroundps_avx(auVar108,1);
        auVar76 = vcmpps_avx(auVar108,auVar75,1);
        auVar76 = vandps_avx(auVar158,auVar76);
        auVar76 = vsubps_avx(auVar75,auVar76);
        auVar13._4_4_ = auVar76._4_4_ * 0.6931472;
        auVar13._0_4_ = auVar76._0_4_ * 0.6931472;
        auVar13._8_4_ = auVar76._8_4_ * 0.6931472;
        auVar13._12_4_ = auVar76._12_4_ * 0.6931472;
        auVar13._16_4_ = auVar76._16_4_ * 0.6931472;
        auVar13._20_4_ = auVar76._20_4_ * 0.6931472;
        auVar13._24_4_ = auVar76._24_4_ * 0.6931472;
        auVar13._28_4_ = auVar75._28_4_;
        auVar77 = vsubps_avx(auVar77,auVar13);
        fVar100 = auVar77._0_4_;
        fVar83 = auVar77._4_4_;
        fVar95 = auVar77._8_4_;
        fVar96 = auVar77._12_4_;
        fVar97 = auVar77._16_4_;
        fVar98 = auVar77._20_4_;
        fVar99 = auVar77._24_4_;
        in_ZMM9 = ZEXT3264(CONCAT428(0x3f000000,
                                     CONCAT424(0x3f000000,
                                               CONCAT420(0x3f000000,
                                                         CONCAT416(0x3f000000,
                                                                   CONCAT412(0x3f000000,
                                                                             CONCAT48(0x3f000000,
                                                                                                                                                                            
                                                  0x3f0000003f000000)))))));
        auVar105._0_4_ = (int)auVar76._0_4_;
        auVar105._4_4_ = (int)auVar76._4_4_;
        auVar105._8_4_ = (int)auVar76._8_4_;
        auVar105._12_4_ = (int)auVar76._12_4_;
        auVar109._16_4_ = (int)auVar76._16_4_;
        auVar109._0_16_ = auVar105;
        auVar109._20_4_ = (int)auVar76._20_4_;
        auVar109._24_4_ = (int)auVar76._24_4_;
        auVar109._28_4_ = (int)auVar76._28_4_;
        auVar101 = vpslld_avx(auVar105,0x17);
        auVar85 = vpslld_avx(auVar109._16_16_,0x17);
        auVar85 = vpaddd_avx(auVar85,auVar139);
        auVar101 = vpaddd_avx(auVar101,auVar139);
        auVar79._0_4_ =
             (fVar100 + 1.0 +
             fVar100 * fVar100 *
             (((((fVar100 * 0.00019875691 + 0.0013981999) * fVar100 + 0.008333452) * fVar100 +
               0.041665796) * fVar100 + 0.16666666) * fVar100 + 0.5)) * auVar101._0_4_ + 1.0;
        auVar79._4_4_ =
             (fVar83 + 1.0 +
             fVar83 * fVar83 *
             (((((fVar83 * 0.00019875691 + 0.0013981999) * fVar83 + 0.008333452) * fVar83 +
               0.041665796) * fVar83 + 0.16666666) * fVar83 + 0.5)) * auVar101._4_4_ + 1.0;
        auVar79._8_4_ =
             (fVar95 + 1.0 +
             fVar95 * fVar95 *
             (((((fVar95 * 0.00019875691 + 0.0013981999) * fVar95 + 0.008333452) * fVar95 +
               0.041665796) * fVar95 + 0.16666666) * fVar95 + 0.5)) * auVar101._8_4_ + 1.0;
        auVar79._12_4_ =
             (fVar96 + 1.0 +
             fVar96 * fVar96 *
             (((((fVar96 * 0.00019875691 + 0.0013981999) * fVar96 + 0.008333452) * fVar96 +
               0.041665796) * fVar96 + 0.16666666) * fVar96 + 0.5)) * auVar101._12_4_ + 1.0;
        auVar79._16_4_ =
             (fVar97 + 1.0 +
             fVar97 * fVar97 *
             (((((fVar97 * 0.00019875691 + 0.0013981999) * fVar97 + 0.008333452) * fVar97 +
               0.041665796) * fVar97 + 0.16666666) * fVar97 + 0.5)) * auVar85._0_4_ + 1.0;
        auVar79._20_4_ =
             (fVar98 + 1.0 +
             fVar98 * fVar98 *
             (((((fVar98 * 0.00019875691 + 0.0013981999) * fVar98 + 0.008333452) * fVar98 +
               0.041665796) * fVar98 + 0.16666666) * fVar98 + 0.5)) * auVar85._4_4_ + 1.0;
        auVar79._24_4_ =
             (fVar99 + 1.0 +
             fVar99 * fVar99 *
             (((((fVar99 * 0.00019875691 + 0.0013981999) * fVar99 + 0.008333452) * fVar99 +
               0.041665796) * fVar99 + 0.16666666) * fVar99 + 0.5)) * auVar85._8_4_ + 1.0;
        auVar79._28_4_ = auVar77._28_4_ + 1.0 + auVar75._28_4_ + 1.0;
        auVar76 = vrcpps_avx(auVar79);
        fVar100 = auVar76._0_4_;
        fVar83 = auVar76._4_4_;
        fVar95 = auVar76._8_4_;
        fVar96 = auVar76._12_4_;
        fVar97 = auVar76._16_4_;
        fVar98 = auVar76._20_4_;
        fVar99 = auVar76._24_4_;
        fVar126 = auVar76._28_4_ + auVar76._28_4_;
        auVar14._4_4_ = auVar79._4_4_ * (fVar83 + fVar83);
        auVar14._0_4_ = auVar79._0_4_ * (fVar100 + fVar100);
        auVar14._8_4_ = auVar79._8_4_ * (fVar95 + fVar95);
        auVar14._12_4_ = auVar79._12_4_ * (fVar96 + fVar96);
        auVar14._16_4_ = auVar79._16_4_ * (fVar97 + fVar97);
        auVar14._20_4_ = auVar79._20_4_ * (fVar98 + fVar98);
        auVar14._24_4_ = auVar79._24_4_ * (fVar99 + fVar99);
        auVar14._28_4_ = auVar79._28_4_;
        auVar127._8_4_ = 0x40000000;
        auVar127._0_8_ = 0x4000000040000000;
        auVar127._12_4_ = 0x40000000;
        auVar127._16_4_ = 0x40000000;
        auVar127._20_4_ = 0x40000000;
        auVar127._24_4_ = 0x40000000;
        auVar127._28_4_ = 0x40000000;
        auVar76 = vsubps_avx(auVar127,auVar14);
        auVar110._0_4_ = fVar100 + fVar100 + -1.0 + fVar100 * auVar76._0_4_;
        auVar110._4_4_ = fVar83 + fVar83 + -1.0 + fVar83 * auVar76._4_4_;
        auVar110._8_4_ = fVar95 + fVar95 + -1.0 + fVar95 * auVar76._8_4_;
        auVar110._12_4_ = fVar96 + fVar96 + -1.0 + fVar96 * auVar76._12_4_;
        auVar110._16_4_ = fVar97 + fVar97 + -1.0 + fVar97 * auVar76._16_4_;
        auVar110._20_4_ = fVar98 + fVar98 + -1.0 + fVar98 * auVar76._20_4_;
        auVar110._24_4_ = fVar99 + fVar99 + -1.0 + fVar99 * auVar76._24_4_;
        auVar110._28_4_ = fVar126 + -1.0 + auVar76._28_4_;
        fVar151 = auVar110._0_4_ * auVar86._0_4_;
        fVar152 = auVar110._4_4_ * auVar86._4_4_;
        fVar153 = auVar110._8_4_ * auVar86._8_4_;
        fVar154 = auVar110._12_4_ * auVar86._12_4_;
        fVar155 = auVar110._16_4_ * auVar86._16_4_;
        fVar156 = auVar110._20_4_ * auVar86._20_4_;
        fVar157 = auVar110._24_4_ * auVar86._24_4_;
        auVar15._4_4_ = fVar152 * auVar102._4_4_;
        auVar15._0_4_ = fVar151 * auVar102._0_4_;
        auVar15._8_4_ = fVar153 * auVar102._8_4_;
        auVar15._12_4_ = fVar154 * auVar102._12_4_;
        auVar15._16_4_ = fVar155 * auVar102._16_4_;
        auVar15._20_4_ = fVar156 * auVar102._20_4_;
        auVar15._24_4_ = fVar157 * auVar102._24_4_;
        auVar15._28_4_ = auVar102._28_4_;
        auVar10 = vsubps_avx(auVar110,auVar15);
        auVar76 = *(undefined1 (*) [32])((long)(_func_int ***)local_78.data + lVar27 + lVar30);
        auVar111._0_8_ = auVar76._0_8_ ^ 0x8000000080000000;
        auVar111._8_4_ = auVar76._8_4_ ^ 0x80000000;
        auVar111._12_4_ = auVar76._12_4_ ^ 0x80000000;
        auVar111._16_4_ = auVar76._16_4_ ^ 0x80000000;
        auVar111._20_4_ = auVar76._20_4_ ^ 0x80000000;
        auVar111._24_4_ = auVar76._24_4_ ^ 0x80000000;
        auVar111._28_4_ = auVar76._28_4_ ^ 0x80000000;
        auVar80._8_4_ = 0x42b0c0a5;
        auVar80._0_8_ = 0x42b0c0a542b0c0a5;
        auVar80._12_4_ = 0x42b0c0a5;
        auVar80._16_4_ = 0x42b0c0a5;
        auVar80._20_4_ = 0x42b0c0a5;
        auVar80._24_4_ = 0x42b0c0a5;
        auVar80._28_4_ = 0x42b0c0a5;
        auVar76 = vminps_avx(auVar111,auVar80);
        auVar77 = vmaxps_avx(auVar142,auVar76);
        auVar120._0_4_ = auVar77._0_4_ * 1.442695 + 0.5;
        auVar120._4_4_ = auVar77._4_4_ * 1.442695 + 0.5;
        auVar120._8_4_ = auVar77._8_4_ * 1.442695 + 0.5;
        auVar120._12_4_ = auVar77._12_4_ * 1.442695 + 0.5;
        auVar120._16_4_ = auVar77._16_4_ * 1.442695 + 0.5;
        auVar120._20_4_ = auVar77._20_4_ * 1.442695 + 0.5;
        auVar120._24_4_ = auVar77._24_4_ * 1.442695 + 0.5;
        auVar120._28_4_ = fVar126 + 0.5;
        auVar75 = vroundps_avx(auVar120,1);
        auVar76 = vcmpps_avx(auVar120,auVar75,1);
        auVar76 = vandps_avx(auVar158,auVar76);
        auVar76 = vsubps_avx(auVar75,auVar76);
        auVar16._4_4_ = auVar76._4_4_ * 0.6931472;
        auVar16._0_4_ = auVar76._0_4_ * 0.6931472;
        auVar16._8_4_ = auVar76._8_4_ * 0.6931472;
        auVar16._12_4_ = auVar76._12_4_ * 0.6931472;
        auVar16._16_4_ = auVar76._16_4_ * 0.6931472;
        auVar16._20_4_ = auVar76._20_4_ * 0.6931472;
        auVar16._24_4_ = auVar76._24_4_ * 0.6931472;
        auVar16._28_4_ = auVar75._28_4_;
        auVar77 = vsubps_avx(auVar77,auVar16);
        fVar100 = auVar77._0_4_;
        fVar83 = auVar77._4_4_;
        fVar95 = auVar77._8_4_;
        fVar96 = auVar77._12_4_;
        fVar97 = auVar77._16_4_;
        fVar98 = auVar77._20_4_;
        fVar99 = auVar77._24_4_;
        auVar117._0_4_ = (int)auVar76._0_4_;
        auVar117._4_4_ = (int)auVar76._4_4_;
        auVar117._8_4_ = (int)auVar76._8_4_;
        auVar117._12_4_ = (int)auVar76._12_4_;
        auVar121._16_4_ = (int)auVar76._16_4_;
        auVar121._0_16_ = auVar117;
        auVar121._20_4_ = (int)auVar76._20_4_;
        auVar121._24_4_ = (int)auVar76._24_4_;
        auVar121._28_4_ = (int)auVar76._28_4_;
        auVar101 = vpslld_avx(auVar117,0x17);
        auVar85 = vpslld_avx(auVar121._16_16_,0x17);
        auVar85 = vpaddd_avx(auVar85,auVar139);
        auVar101 = vpaddd_avx(auVar101,auVar139);
        auVar112._0_4_ =
             (fVar100 + 1.0 +
             fVar100 * fVar100 *
             (((((fVar100 * 0.00019875691 + 0.0013981999) * fVar100 + 0.008333452) * fVar100 +
               0.041665796) * fVar100 + 0.16666666) * fVar100 + 0.5)) * auVar101._0_4_ + 1.0;
        auVar112._4_4_ =
             (fVar83 + 1.0 +
             fVar83 * fVar83 *
             (((((fVar83 * 0.00019875691 + 0.0013981999) * fVar83 + 0.008333452) * fVar83 +
               0.041665796) * fVar83 + 0.16666666) * fVar83 + 0.5)) * auVar101._4_4_ + 1.0;
        auVar112._8_4_ =
             (fVar95 + 1.0 +
             fVar95 * fVar95 *
             (((((fVar95 * 0.00019875691 + 0.0013981999) * fVar95 + 0.008333452) * fVar95 +
               0.041665796) * fVar95 + 0.16666666) * fVar95 + 0.5)) * auVar101._8_4_ + 1.0;
        auVar112._12_4_ =
             (fVar96 + 1.0 +
             fVar96 * fVar96 *
             (((((fVar96 * 0.00019875691 + 0.0013981999) * fVar96 + 0.008333452) * fVar96 +
               0.041665796) * fVar96 + 0.16666666) * fVar96 + 0.5)) * auVar101._12_4_ + 1.0;
        auVar112._16_4_ =
             (fVar97 + 1.0 +
             fVar97 * fVar97 *
             (((((fVar97 * 0.00019875691 + 0.0013981999) * fVar97 + 0.008333452) * fVar97 +
               0.041665796) * fVar97 + 0.16666666) * fVar97 + 0.5)) * auVar85._0_4_ + 1.0;
        auVar112._20_4_ =
             (fVar98 + 1.0 +
             fVar98 * fVar98 *
             (((((fVar98 * 0.00019875691 + 0.0013981999) * fVar98 + 0.008333452) * fVar98 +
               0.041665796) * fVar98 + 0.16666666) * fVar98 + 0.5)) * auVar85._4_4_ + 1.0;
        auVar112._24_4_ =
             (fVar99 + 1.0 +
             fVar99 * fVar99 *
             (((((fVar99 * 0.00019875691 + 0.0013981999) * fVar99 + 0.008333452) * fVar99 +
               0.041665796) * fVar99 + 0.16666666) * fVar99 + 0.5)) * auVar85._8_4_ + 1.0;
        auVar112._28_4_ = auVar77._28_4_ + 1.0 + auVar75._28_4_ + 1.0;
        auVar75 = vrcpps_avx(auVar112);
        fVar143 = auVar86._0_4_ * auVar10._0_4_;
        fVar144 = auVar86._4_4_ * auVar10._4_4_;
        fVar145 = auVar86._8_4_ * auVar10._8_4_;
        fVar146 = auVar86._12_4_ * auVar10._12_4_;
        fVar147 = auVar86._16_4_ * auVar10._16_4_;
        fVar148 = auVar86._20_4_ * auVar10._20_4_;
        fVar149 = auVar86._24_4_ * auVar10._24_4_;
        in_ZMM10 = ZEXT3264(CONCAT428(0x3fb8aa3b,
                                      CONCAT424(fVar149,CONCAT420(fVar148,CONCAT416(fVar147,
                                                  CONCAT412(fVar146,CONCAT48(fVar145,CONCAT44(
                                                  fVar144,fVar143))))))));
        auVar76 = *(undefined1 (*) [32])((long)pvVar6 + lVar27);
        fVar83 = auVar76._0_4_ * auVar75._0_4_;
        fVar96 = auVar76._4_4_ * auVar75._4_4_;
        fVar98 = auVar76._8_4_ * auVar75._8_4_;
        fVar126 = auVar76._12_4_ * auVar75._12_4_;
        fVar129 = auVar76._16_4_ * auVar75._16_4_;
        fVar130 = auVar76._20_4_ * auVar75._20_4_;
        fVar131 = auVar76._24_4_ * auVar75._24_4_;
        auVar17._4_4_ = auVar112._4_4_ * fVar96;
        auVar17._0_4_ = auVar112._0_4_ * fVar83;
        auVar17._8_4_ = auVar112._8_4_ * fVar98;
        auVar17._12_4_ = auVar112._12_4_ * fVar126;
        auVar17._16_4_ = auVar112._16_4_ * fVar129;
        auVar17._20_4_ = auVar112._20_4_ * fVar130;
        auVar17._24_4_ = auVar112._24_4_ * fVar131;
        auVar17._28_4_ = auVar112._28_4_;
        auVar10 = vsubps_avx(auVar76,auVar17);
        auVar76 = *(undefined1 (*) [32])((long)(_func_int ***)local_78.data + lVar27 + lVar30 * 2);
        auVar122._0_8_ = auVar76._0_8_ ^ 0x8000000080000000;
        auVar122._8_4_ = auVar76._8_4_ ^ 0x80000000;
        auVar122._12_4_ = auVar76._12_4_ ^ 0x80000000;
        auVar122._16_4_ = auVar76._16_4_ ^ 0x80000000;
        auVar122._20_4_ = auVar76._20_4_ ^ 0x80000000;
        auVar122._24_4_ = auVar76._24_4_ ^ 0x80000000;
        auVar122._28_4_ = -auVar76._28_4_;
        auVar89._8_4_ = 0x42b0c0a5;
        auVar89._0_8_ = 0x42b0c0a542b0c0a5;
        auVar89._12_4_ = 0x42b0c0a5;
        auVar89._16_4_ = 0x42b0c0a5;
        auVar89._20_4_ = 0x42b0c0a5;
        auVar89._24_4_ = 0x42b0c0a5;
        auVar89._28_4_ = 0x42b0c0a5;
        auVar76 = vminps_avx(auVar122,auVar89);
        auVar90._8_4_ = 0xc2b0c0a5;
        auVar90._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar90._12_4_ = 0xc2b0c0a5;
        auVar90._16_4_ = 0xc2b0c0a5;
        auVar90._20_4_ = 0xc2b0c0a5;
        auVar90._24_4_ = 0xc2b0c0a5;
        auVar90._28_4_ = 0xc2b0c0a5;
        auVar77 = vmaxps_avx(auVar76,auVar90);
        auVar123._0_4_ = auVar77._0_4_ * 1.442695 + 0.5;
        auVar123._4_4_ = auVar77._4_4_ * 1.442695 + 0.5;
        auVar123._8_4_ = auVar77._8_4_ * 1.442695 + 0.5;
        auVar123._12_4_ = auVar77._12_4_ * 1.442695 + 0.5;
        auVar123._16_4_ = auVar77._16_4_ * 1.442695 + 0.5;
        auVar123._20_4_ = auVar77._20_4_ * 1.442695 + 0.5;
        auVar123._24_4_ = auVar77._24_4_ * 1.442695 + 0.5;
        auVar123._28_4_ = auVar122._28_4_ + 0.5;
        auVar86 = vroundps_avx(auVar123,1);
        auVar76 = vcmpps_avx(auVar123,auVar86,1);
        auVar76 = vandps_avx(auVar158,auVar76);
        auVar76 = vsubps_avx(auVar86,auVar76);
        auVar18._4_4_ = auVar76._4_4_ * 0.6931472;
        auVar18._0_4_ = auVar76._0_4_ * 0.6931472;
        auVar18._8_4_ = auVar76._8_4_ * 0.6931472;
        auVar18._12_4_ = auVar76._12_4_ * 0.6931472;
        auVar18._16_4_ = auVar76._16_4_ * 0.6931472;
        auVar18._20_4_ = auVar76._20_4_ * 0.6931472;
        auVar18._24_4_ = auVar76._24_4_ * 0.6931472;
        auVar18._28_4_ = auVar86._28_4_;
        auVar11 = vsubps_avx(auVar77,auVar18);
        fVar100 = auVar11._0_4_;
        fVar95 = auVar11._4_4_;
        fVar97 = auVar11._8_4_;
        fVar99 = auVar11._12_4_;
        fVar150 = auVar11._16_4_;
        fVar8 = auVar11._20_4_;
        fVar9 = auVar11._24_4_;
        fVar132 = ((((fVar100 * 0.00019875691 + 0.0013981999) * fVar100 + 0.008333452) * fVar100 +
                   0.041665796) * fVar100 + 0.16666666) * fVar100 + 0.5;
        fVar133 = ((((fVar95 * 0.00019875691 + 0.0013981999) * fVar95 + 0.008333452) * fVar95 +
                   0.041665796) * fVar95 + 0.16666666) * fVar95 + 0.5;
        fVar134 = ((((fVar97 * 0.00019875691 + 0.0013981999) * fVar97 + 0.008333452) * fVar97 +
                   0.041665796) * fVar97 + 0.16666666) * fVar97 + 0.5;
        fVar135 = ((((fVar99 * 0.00019875691 + 0.0013981999) * fVar99 + 0.008333452) * fVar99 +
                   0.041665796) * fVar99 + 0.16666666) * fVar99 + 0.5;
        fVar136 = ((((fVar150 * 0.00019875691 + 0.0013981999) * fVar150 + 0.008333452) * fVar150 +
                   0.041665796) * fVar150 + 0.16666666) * fVar150 + 0.5;
        fVar137 = ((((fVar8 * 0.00019875691 + 0.0013981999) * fVar8 + 0.008333452) * fVar8 +
                   0.041665796) * fVar8 + 0.16666666) * fVar8 + 0.5;
        fVar138 = ((((fVar9 * 0.00019875691 + 0.0013981999) * fVar9 + 0.008333452) * fVar9 +
                   0.041665796) * fVar9 + 0.16666666) * fVar9 + 0.5;
        in_ZMM6 = ZEXT3264(CONCAT428(0x3fbd285a,
                                     CONCAT424(fVar138,CONCAT420(fVar137,CONCAT416(fVar136,CONCAT412
                                                  (fVar135,CONCAT48(fVar134,CONCAT44(fVar133,fVar132
                                                                                    ))))))));
        auVar118._0_4_ = (int)auVar76._0_4_;
        auVar118._4_4_ = (int)auVar76._4_4_;
        auVar118._8_4_ = (int)auVar76._8_4_;
        auVar118._12_4_ = (int)auVar76._12_4_;
        auVar124._16_4_ = (int)auVar76._16_4_;
        auVar124._0_16_ = auVar118;
        auVar124._20_4_ = (int)auVar76._20_4_;
        auVar124._24_4_ = (int)auVar76._24_4_;
        auVar124._28_4_ = (int)auVar76._28_4_;
        auVar101 = vpslld_avx(auVar118,0x17);
        auVar85 = vpslld_avx(auVar124._16_16_,0x17);
        auVar85 = vpaddd_avx(auVar85,auVar139);
        auVar101 = vpaddd_avx(auVar101,auVar139);
        auVar81._0_4_ = fVar143 + fVar151 + fVar83 + auVar75._0_4_ * auVar10._0_4_;
        auVar81._4_4_ = fVar144 + fVar152 + fVar96 + auVar75._4_4_ * auVar10._4_4_;
        auVar81._8_4_ = fVar145 + fVar153 + fVar98 + auVar75._8_4_ * auVar10._8_4_;
        auVar81._12_4_ = fVar146 + fVar154 + fVar126 + auVar75._12_4_ * auVar10._12_4_;
        auVar81._16_4_ = fVar147 + fVar155 + fVar129 + auVar75._16_4_ * auVar10._16_4_;
        auVar81._20_4_ = fVar148 + fVar156 + fVar130 + auVar75._20_4_ * auVar10._20_4_;
        auVar81._24_4_ = fVar149 + fVar157 + fVar131 + auVar75._24_4_ * auVar10._24_4_;
        auVar81._28_4_ = auVar10._28_4_ + 0.0 + 0.5 + 1.442695;
        auVar19._4_4_ = auVar81._4_4_ * -2.0;
        auVar19._0_4_ = auVar81._0_4_ * -2.0;
        auVar19._8_4_ = auVar81._8_4_ * -2.0;
        auVar19._12_4_ = auVar81._12_4_ * -2.0;
        auVar19._16_4_ = auVar81._16_4_ * -2.0;
        auVar19._20_4_ = auVar81._20_4_ * -2.0;
        auVar19._24_4_ = auVar81._24_4_ * -2.0;
        auVar19._28_4_ = 0xc0000000;
        auVar113._8_4_ = 0x42b0c0a5;
        auVar113._0_8_ = 0x42b0c0a542b0c0a5;
        auVar113._12_4_ = 0x42b0c0a5;
        auVar113._16_4_ = 0x42b0c0a5;
        auVar113._20_4_ = 0x42b0c0a5;
        auVar113._24_4_ = 0x42b0c0a5;
        auVar113._28_4_ = 0x42b0c0a5;
        auVar76 = vminps_avx(auVar19,auVar113);
        auVar114._8_4_ = 0xc2b0c0a5;
        auVar114._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar114._12_4_ = 0xc2b0c0a5;
        auVar114._16_4_ = 0xc2b0c0a5;
        auVar114._20_4_ = 0xc2b0c0a5;
        auVar114._24_4_ = 0xc2b0c0a5;
        auVar114._28_4_ = 0xc2b0c0a5;
        auVar77 = vmaxps_avx(auVar76,auVar114);
        auVar115._0_4_ = auVar77._0_4_ * 1.442695 + 0.5;
        auVar115._4_4_ = auVar77._4_4_ * 1.442695 + 0.5;
        auVar115._8_4_ = auVar77._8_4_ * 1.442695 + 0.5;
        auVar115._12_4_ = auVar77._12_4_ * 1.442695 + 0.5;
        auVar115._16_4_ = auVar77._16_4_ * 1.442695 + 0.5;
        auVar115._20_4_ = auVar77._20_4_ * 1.442695 + 0.5;
        auVar115._24_4_ = auVar77._24_4_ * 1.442695 + 0.5;
        auVar115._28_4_ = 0xc2afc0a5;
        auVar75 = vroundps_avx(auVar115,1);
        auVar76 = vcmpps_avx(auVar115,auVar75,1);
        auVar76 = vandps_avx(auVar158,auVar76);
        auVar76 = vsubps_avx(auVar75,auVar76);
        auVar20._4_4_ = auVar76._4_4_ * 0.6931472;
        auVar20._0_4_ = auVar76._0_4_ * 0.6931472;
        auVar20._8_4_ = auVar76._8_4_ * 0.6931472;
        auVar20._12_4_ = auVar76._12_4_ * 0.6931472;
        auVar20._16_4_ = auVar76._16_4_ * 0.6931472;
        auVar20._20_4_ = auVar76._20_4_ * 0.6931472;
        auVar20._24_4_ = auVar76._24_4_ * 0.6931472;
        auVar20._28_4_ = 0x3f317218;
        auVar77 = vsubps_avx(auVar77,auVar20);
        fVar83 = auVar77._0_4_;
        fVar96 = auVar77._4_4_;
        fVar98 = auVar77._8_4_;
        fVar126 = auVar77._12_4_;
        fVar129 = auVar77._16_4_;
        fVar130 = auVar77._20_4_;
        fVar131 = auVar77._24_4_;
        auVar106._0_4_ = (int)auVar76._0_4_;
        auVar106._4_4_ = (int)auVar76._4_4_;
        auVar106._8_4_ = (int)auVar76._8_4_;
        auVar106._12_4_ = (int)auVar76._12_4_;
        auVar116._16_4_ = (int)auVar76._16_4_;
        auVar116._0_16_ = auVar106;
        auVar116._20_4_ = (int)auVar76._20_4_;
        auVar116._24_4_ = (int)auVar76._24_4_;
        auVar116._28_4_ = (int)auVar76._28_4_;
        auVar119 = vpslld_avx(auVar106,0x17);
        auVar107 = vpslld_avx(auVar116._16_16_,0x17);
        auVar107 = vpaddd_avx(auVar107,auVar139);
        auVar119 = vpaddd_avx(auVar119,auVar139);
        auVar91._0_4_ =
             (fVar83 + 1.0 +
             fVar83 * fVar83 *
             (((((fVar83 * 0.00019875691 + 0.0013981999) * fVar83 + 0.008333452) * fVar83 +
               0.041665796) * fVar83 + 0.16666666) * fVar83 + 0.5)) * auVar119._0_4_ + 1.0;
        auVar91._4_4_ =
             (fVar96 + 1.0 +
             fVar96 * fVar96 *
             (((((fVar96 * 0.00019875691 + 0.0013981999) * fVar96 + 0.008333452) * fVar96 +
               0.041665796) * fVar96 + 0.16666666) * fVar96 + 0.5)) * auVar119._4_4_ + 1.0;
        auVar91._8_4_ =
             (fVar98 + 1.0 +
             fVar98 * fVar98 *
             (((((fVar98 * 0.00019875691 + 0.0013981999) * fVar98 + 0.008333452) * fVar98 +
               0.041665796) * fVar98 + 0.16666666) * fVar98 + 0.5)) * auVar119._8_4_ + 1.0;
        auVar91._12_4_ =
             (fVar126 + 1.0 +
             fVar126 * fVar126 *
             (((((fVar126 * 0.00019875691 + 0.0013981999) * fVar126 + 0.008333452) * fVar126 +
               0.041665796) * fVar126 + 0.16666666) * fVar126 + 0.5)) * auVar119._12_4_ + 1.0;
        auVar91._16_4_ =
             (fVar129 + 1.0 +
             fVar129 * fVar129 *
             (((((fVar129 * 0.00019875691 + 0.0013981999) * fVar129 + 0.008333452) * fVar129 +
               0.041665796) * fVar129 + 0.16666666) * fVar129 + 0.5)) * auVar107._0_4_ + 1.0;
        auVar91._20_4_ =
             (fVar130 + 1.0 +
             fVar130 * fVar130 *
             (((((fVar130 * 0.00019875691 + 0.0013981999) * fVar130 + 0.008333452) * fVar130 +
               0.041665796) * fVar130 + 0.16666666) * fVar130 + 0.5)) * auVar107._4_4_ + 1.0;
        auVar91._24_4_ =
             (fVar131 + 1.0 +
             fVar131 * fVar131 *
             (((((fVar131 * 0.00019875691 + 0.0013981999) * fVar131 + 0.008333452) * fVar131 +
               0.041665796) * fVar131 + 0.16666666) * fVar131 + 0.5)) * auVar107._8_4_ + 1.0;
        auVar91._28_4_ = auVar77._28_4_ + 1.0 + 0.6931472 + 1.0;
        auVar76 = vrcpps_avx(auVar91);
        auVar103._0_4_ = (fVar100 + 1.0 + fVar100 * fVar100 * fVar132) * auVar101._0_4_ + 1.0;
        auVar103._4_4_ = (fVar95 + 1.0 + fVar95 * fVar95 * fVar133) * auVar101._4_4_ + 1.0;
        auVar103._8_4_ = (fVar97 + 1.0 + fVar97 * fVar97 * fVar134) * auVar101._8_4_ + 1.0;
        auVar103._12_4_ = (fVar99 + 1.0 + fVar99 * fVar99 * fVar135) * auVar101._12_4_ + 1.0;
        auVar103._16_4_ = (fVar150 + 1.0 + fVar150 * fVar150 * fVar136) * auVar85._0_4_ + 1.0;
        auVar103._20_4_ = (fVar8 + 1.0 + fVar8 * fVar8 * fVar137) * auVar85._4_4_ + 1.0;
        auVar103._24_4_ = (fVar9 + 1.0 + fVar9 * fVar9 * fVar138) * auVar85._8_4_ + 1.0;
        auVar103._28_4_ = auVar11._28_4_ + 1.0 + auVar86._28_4_ + 1.0;
        fVar100 = auVar76._0_4_;
        fVar83 = auVar76._4_4_;
        fVar95 = auVar76._8_4_;
        fVar96 = auVar76._12_4_;
        fVar97 = auVar76._16_4_;
        fVar98 = auVar76._20_4_;
        fVar99 = auVar76._24_4_;
        auVar21._4_4_ = auVar91._4_4_ * (fVar83 + fVar83);
        auVar21._0_4_ = auVar91._0_4_ * (fVar100 + fVar100);
        auVar21._8_4_ = auVar91._8_4_ * (fVar95 + fVar95);
        auVar21._12_4_ = auVar91._12_4_ * (fVar96 + fVar96);
        auVar21._16_4_ = auVar91._16_4_ * (fVar97 + fVar97);
        auVar21._20_4_ = auVar91._20_4_ * (fVar98 + fVar98);
        auVar21._24_4_ = auVar91._24_4_ * (fVar99 + fVar99);
        auVar21._28_4_ = auVar91._28_4_;
        auVar128._8_4_ = 0x40000000;
        auVar128._0_8_ = 0x4000000040000000;
        auVar128._12_4_ = 0x40000000;
        auVar128._16_4_ = 0x40000000;
        auVar128._20_4_ = 0x40000000;
        auVar128._24_4_ = 0x40000000;
        auVar128._28_4_ = 0x40000000;
        auVar86 = vsubps_avx(auVar128,auVar21);
        auVar77 = vrcpps_avx(auVar103);
        in_ZMM3 = ZEXT3264(auVar77);
        in_ZMM5 = ZEXT3264(CONCAT428(0xbf800000,
                                     CONCAT424(0xbf800000,
                                               CONCAT420(0xbf800000,
                                                         CONCAT416(0xbf800000,
                                                                   CONCAT412(0xbf800000,
                                                                             CONCAT48(0xbf800000,
                                                                                                                                                                            
                                                  0xbf800000bf800000)))))));
        fVar126 = auVar76._28_4_ + auVar76._28_4_ + -1.0;
        auVar92._0_4_ = fVar100 + fVar100 + -1.0 + fVar100 * auVar86._0_4_;
        auVar92._4_4_ = fVar83 + fVar83 + -1.0 + fVar83 * auVar86._4_4_;
        auVar92._8_4_ = fVar95 + fVar95 + -1.0 + fVar95 * auVar86._8_4_;
        auVar92._12_4_ = fVar96 + fVar96 + -1.0 + fVar96 * auVar86._12_4_;
        auVar92._16_4_ = fVar97 + fVar97 + -1.0 + fVar97 * auVar86._16_4_;
        auVar92._20_4_ = fVar98 + fVar98 + -1.0 + fVar98 * auVar86._20_4_;
        auVar92._24_4_ = fVar99 + fVar99 + -1.0 + fVar99 * auVar86._24_4_;
        auVar92._28_4_ = fVar126 + auVar86._28_4_;
        fVar100 = auVar92._0_4_ * auVar77._0_4_;
        fVar83 = auVar92._4_4_ * auVar77._4_4_;
        fVar95 = auVar92._8_4_ * auVar77._8_4_;
        fVar96 = auVar92._12_4_ * auVar77._12_4_;
        fVar97 = auVar92._16_4_ * auVar77._16_4_;
        fVar98 = auVar92._20_4_ * auVar77._20_4_;
        fVar99 = auVar92._24_4_ * auVar77._24_4_;
        auVar22._4_4_ = auVar103._4_4_ * fVar83;
        auVar22._0_4_ = auVar103._0_4_ * fVar100;
        auVar22._8_4_ = auVar103._8_4_ * fVar95;
        auVar22._12_4_ = auVar103._12_4_ * fVar96;
        auVar22._16_4_ = auVar103._16_4_ * fVar97;
        auVar22._20_4_ = auVar103._20_4_ * fVar98;
        auVar22._24_4_ = auVar103._24_4_ * fVar99;
        auVar22._28_4_ = auVar103._28_4_;
        auVar76 = vsubps_avx(auVar92,auVar22);
        auVar93._0_4_ = fVar100 + auVar77._0_4_ * auVar76._0_4_;
        auVar93._4_4_ = fVar83 + auVar77._4_4_ * auVar76._4_4_;
        auVar93._8_4_ = fVar95 + auVar77._8_4_ * auVar76._8_4_;
        auVar93._12_4_ = fVar96 + auVar77._12_4_ * auVar76._12_4_;
        auVar93._16_4_ = fVar97 + auVar77._16_4_ * auVar76._16_4_;
        auVar93._20_4_ = fVar98 + auVar77._20_4_ * auVar76._20_4_;
        auVar93._24_4_ = fVar99 + auVar77._24_4_ * auVar76._24_4_;
        auVar93._28_4_ = fVar126 + auVar76._28_4_;
        in_ZMM1 = ZEXT3264(auVar93);
        *(undefined1 (*) [32])((long)pvVar6 + lVar27) = auVar81;
        *(undefined1 (*) [32])((long)pvVar65 + lVar27) = auVar93;
        *(undefined1 (*) [32])((long)pvVar5 + lVar27 + lVar31) = auVar93;
        lVar27 = lVar27 + 0x20;
      }
      for (; 0 < (int)uVar25; uVar25 = uVar25 - 1) {
        fVar100 = *(float *)((long)(_func_int ***)pvVar24 + lVar27 + lVar30 * 3);
        in_ZMM3 = ZEXT1664(in_ZMM3._0_16_);
        in_ZMM5 = ZEXT1664(in_ZMM5._0_16_);
        in_ZMM6 = ZEXT1664(in_ZMM6._0_16_);
        in_ZMM9 = ZEXT1664(in_ZMM9._0_16_);
        in_ZMM10 = ZEXT1664(in_ZMM10._0_16_);
        fVar83 = expf(-*(float *)((long)(_func_int ***)pvVar24 + lVar27));
        fVar95 = expf(-*(float *)((long)(_func_int ***)pvVar24 + lVar27 + lVar30));
        fVar96 = expf(-*(float *)((long)(_func_int ***)pvVar24 + lVar27 + lVar30 * 2));
        fVar100 = tanhf(fVar100);
        fVar100 = *(float *)((long)pvVar6 + lVar27) / (fVar95 + 1.0) + fVar100 / (fVar83 + 1.0);
        fVar83 = tanhf(fVar100);
        fVar83 = fVar83 / (fVar96 + 1.0);
        in_ZMM1 = ZEXT464((uint)fVar100);
        *(float *)((long)pvVar6 + lVar27) = fVar100;
        *(float *)((long)pvVar65 + lVar27) = fVar83;
        *(float *)((long)pvVar5 + lVar27 + lVar31) = fVar83;
        lVar27 = lVar27 + 4;
      }
    }
  }
  piVar23 = (int *)CONCAT44(local_78.refcount._4_4_,(int)local_78.refcount);
  if (piVar23 != (int *)0x0) {
    LOCK();
    *piVar23 = *piVar23 + -1;
    UNLOCK();
    if (*piVar23 == 0) {
      if (local_78.allocator == (Allocator *)0x0) {
        free(local_78.data);
      }
      else {
        (*(local_78.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return local_1c0;
}

Assistant:

static int lstm(const Mat& bottom_blob, Mat& top_blob, int reverse, const Mat& weight_xc, const Mat& bias_c, const Mat& weight_hc, Mat& hidden_state, Mat& cell_state, const Option& opt)
{
    int size = bottom_blob.w;
    int T = bottom_blob.h;

    int num_output = top_blob.w;

    // 4 x num_output
    Mat gates(4, num_output, 4u, opt.workspace_allocator);
    if (gates.empty())
        return -100;

    // unroll
    for (int t = 0; t < T; t++)
    {
        // clip hidden by continuation indicator
        // h_cont_{t-1} = cont_t * h_{t-1}
        // h_cont_{t-1} = h_{t-1} if cont_t == 1
        //                0       otherwise
        // calculate hidden
        // gate_input_t := W_hc * h_conted_{t-1} + W_xc * x_t + b_c

        int ti = reverse ? T - 1 - t : t;

        const float* x = bottom_blob.row(ti);
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < num_output; q++)
        {
            const float* bias_c_I = bias_c.row(0);
            const float* bias_c_F = bias_c.row(1);
            const float* bias_c_O = bias_c.row(2);
            const float* bias_c_G = bias_c.row(3);

            float* gates_data = gates.row(q);

            // gate I F O G
            const float* weight_xc_I = weight_xc.row(num_output * 0 + q);
            const float* weight_xc_F = weight_xc.row(num_output * 1 + q);
            const float* weight_xc_O = weight_xc.row(num_output * 2 + q);
            const float* weight_xc_G = weight_xc.row(num_output * 3 + q);

            const float* weight_hc_I = weight_hc.row(num_output * 0 + q);
            const float* weight_hc_F = weight_hc.row(num_output * 1 + q);
            const float* weight_hc_O = weight_hc.row(num_output * 2 + q);
            const float* weight_hc_G = weight_hc.row(num_output * 3 + q);

            float I = bias_c_I[q];
            float F = bias_c_F[q];
            float O = bias_c_O[q];
            float G = bias_c_G[q];

            for (int i = 0; i < size; i++)
            {
                float xi = x[i];

                I += weight_xc_I[i] * xi;
                F += weight_xc_F[i] * xi;
                O += weight_xc_O[i] * xi;
                G += weight_xc_G[i] * xi;
            }

            for (int i = 0; i < num_output; i++)
            {
                float h_cont = hidden_state[i];

                I += weight_hc_I[i] * h_cont;
                F += weight_hc_F[i] * h_cont;
                O += weight_hc_O[i] * h_cont;
                G += weight_hc_G[i] * h_cont;
            }

            gates_data[0] = I;
            gates_data[1] = F;
            gates_data[2] = O;
            gates_data[3] = G;
        }

        // lstm unit
        // sigmoid(I)
        // sigmoid(F)
        // sigmoid(O)
        // tanh(G)
        // c_t := f_t .* c_{t-1} + i_t .* g_t
        // h_t := o_t .* tanh[c_t]
        float* output_data = top_blob.row(ti);
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < num_output; q++)
        {
            const float* gates_data = gates.row(q);

            float I = gates_data[0];
            float F = gates_data[1];
            float O = gates_data[2];
            float G = gates_data[3];

            I = 1.f / (1.f + exp(-I));
            F = 1.f / (1.f + exp(-F));
            O = 1.f / (1.f + exp(-O));
            G = tanh(G);

            float cell2 = F * cell_state[q] + I * G;
            float H = O * tanh(cell2);
            cell_state[q] = cell2;
            hidden_state[q] = H;
            output_data[q] = H;
        }
    }

    return 0;
}